

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O3

void __thiscall
chrono::fea::ShellANCF_Jacobian::Evaluate
          (ShellANCF_Jacobian *this,ChVectorN<double,_696> *result,double x,double y,double z)

{
  double *pdVar1;
  double *pdVar2;
  plain_array<double,_36,_1,_32> *ppVar3;
  double *pdVar4;
  double *pdVar5;
  plain_array<double,_30,_1,_16> *ppVar6;
  undefined1 (*pauVar7) [64];
  undefined8 uVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ChElementShellANCF_3423 *pCVar34;
  size_t sVar35;
  pointer pMVar36;
  ulong uVar37;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  bool bVar55;
  undefined1 auVar56 [16];
  undefined8 uVar57;
  ChVectorN<double,_696> *pCVar58;
  Matrix<double,_9,_24,_1,_9,_24> *a_rhs;
  Index row_2;
  undefined1 (*pauVar59) [32];
  bool bVar60;
  Index row_1;
  mul_assign_op<double,_double> *pmVar61;
  Index col;
  long lVar62;
  double *pdVar63;
  double *pdVar64;
  ulong *puVar65;
  long lVar66;
  int i;
  LhsNested actual_lhs;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar90 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar87 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar88 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar89 [32];
  undefined1 auVar101 [64];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  undefined1 auVar120 [64];
  undefined1 auVar121 [64];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined8 in_XMM0_Qb;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 extraout_var [56];
  double dVar130;
  double dVar131;
  undefined8 in_XMM1_Qb;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  double dVar136;
  undefined1 auVar135 [16];
  double dVar137;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  double dVar143;
  double dVar150;
  undefined1 auVar148 [16];
  undefined1 auVar149 [64];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  double dVar161;
  double dVar162;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  double dVar167;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  double dVar168;
  double dVar169;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  double dVar176;
  double dVar177;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  double dVar183;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  ShapeVector Ny;
  ShapeVector Nx;
  ChMatrixNM<double,_1,_3> tempB3;
  DstEvaluatorType dstEvaluator_1;
  ChVectorN<double,_6> stress;
  ChMatrixNM<double,_1,_3> tempB31;
  ChVectorN<double,_6> strain_EAS;
  ChMatrixNM<double,_6,_5> M;
  ChMatrixNM<double,_1,_3> Nz_d0;
  ChMatrixNM<double,_1,_3> Ny_d0;
  ChMatrixNM<double,_1,_3> Nx_d0;
  SrcEvaluatorType srcEvaluator_1;
  ChVectorN<double,_8> ddNy;
  ChVectorN<double,_8> ddNx;
  ShapeVector Nz;
  ChVectorN<double,_8> d0d0Ny;
  ChVectorN<double,_8> d0d0Nx;
  ChMatrixNM<double,_6,_5> G;
  ChMatrixNM<double,_6,_24> strainD;
  ChMatrixNM<double,_24,_24> KTE;
  ChMatrixNM<double,_5,_24> GDEPSP;
  ChMatrixNM<double,_9,_24> Gd;
  mul_assign_op<double,_double> local_54e1;
  undefined1 local_54e0 [16];
  undefined1 local_54d0 [16];
  undefined1 local_54c0 [16];
  undefined1 local_54b0 [16];
  undefined1 local_54a0 [16];
  undefined1 local_5490 [16];
  ShapeVector local_5480;
  ShapeVector local_5440;
  undefined1 local_53f0 [16];
  undefined1 local_53e0 [16];
  undefined1 local_53d0 [16];
  double local_53c0;
  undefined8 uStack_53b8;
  undefined1 local_53b0 [16];
  double dStack_53a0;
  undefined1 local_5390 [16];
  undefined1 local_5380 [16];
  undefined1 local_5370 [24];
  ChVectorN<double,_696> *local_5358;
  double local_5350;
  undefined1 local_5348 [8];
  undefined1 local_5340 [64];
  undefined1 local_5300 [80];
  double local_52b0 [6];
  ulong local_5280;
  undefined1 local_5278 [16];
  undefined8 local_5268;
  double local_5250;
  undefined8 uStack_5248;
  double local_5240;
  undefined8 uStack_5238;
  double local_5230;
  undefined8 uStack_5228;
  undefined1 local_5220 [16];
  undefined8 uStack_5210;
  undefined1 local_5200 [64];
  undefined1 local_51c0 [64];
  undefined1 local_5180 [64];
  double local_5130 [6];
  undefined1 local_5100 [64];
  undefined1 local_50c0 [64];
  undefined1 local_5080 [64];
  undefined1 local_5040 [64];
  undefined1 local_5000 [64];
  undefined1 local_4fc0 [48];
  undefined8 uStack_4f90;
  undefined8 uStack_4f88;
  undefined1 local_4f80 [64];
  undefined1 local_4f40 [64];
  double local_4f00 [20];
  double adStack_4e60 [13];
  ChMatrixNM<double,_1,_3> local_4df8;
  ChMatrixNM<double,_1,_3> local_4de0;
  ChMatrixNM<double,_1,_3> local_4dc8;
  undefined1 local_4db0 [32];
  scalar_constant_op<double> local_4d90;
  ulong local_4d88;
  Product<Eigen::Transpose<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>,_Eigen::Matrix<double,_9,_9,_1,_9,_9>,_0>
  local_4d78;
  Matrix<double,_9,_24,_1,_9,_24> *local_4d68;
  ulong local_4d58;
  Matrix<double,_8,_1,_0,_8,_1> local_4d40;
  Matrix<double,_8,_1,_0,_8,_1> local_4d00;
  DenseStorage<double,_8,_1,_8,_1> local_4cc0;
  undefined1 local_4c80 [64];
  undefined8 local_4c40 [4];
  undefined8 uStack_4c20;
  double dStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 uStack_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  undefined1 local_4bc0 [64];
  undefined1 local_4b80 [32];
  undefined8 uStack_4b60;
  undefined8 uStack_4b58;
  undefined8 uStack_4b50;
  undefined8 uStack_4b48;
  undefined8 local_4b40;
  undefined8 uStack_4b38;
  undefined8 uStack_4b30;
  undefined8 uStack_4b28;
  undefined8 uStack_4b20;
  undefined8 uStack_4b18;
  undefined8 uStack_4b10;
  undefined8 uStack_4b08;
  undefined1 local_4b00 [64];
  undefined8 local_4ac0 [4];
  undefined8 uStack_4aa0;
  undefined8 uStack_4a98;
  undefined8 uStack_4a90;
  undefined8 uStack_4a88;
  undefined8 local_4a80;
  undefined8 uStack_4a78;
  undefined8 uStack_4a70;
  undefined8 uStack_4a68;
  undefined8 uStack_4a60;
  undefined8 uStack_4a58;
  undefined8 uStack_4a50;
  undefined8 uStack_4a48;
  undefined8 local_4a40;
  undefined8 uStack_4a38;
  undefined8 uStack_4a30;
  undefined8 uStack_4a28;
  undefined8 uStack_4a20;
  undefined8 uStack_4a18;
  undefined8 uStack_4a10;
  undefined8 uStack_4a08;
  undefined1 local_4a00 [64];
  undefined1 local_49c0 [64];
  undefined1 local_4980 [64];
  undefined1 local_4940 [64];
  undefined1 local_4900 [64];
  undefined1 local_48c0 [64];
  undefined1 local_4880 [64];
  undefined1 local_4840 [64];
  undefined1 local_4800 [64];
  Matrix<double,_8,_1,_0,_8,_1> local_47c0;
  Matrix<double,_8,_1,_0,_8,_1> local_4780;
  DstXprType local_4730;
  Matrix<double,_6,_24,_1,_6,_24> local_4640;
  undefined1 local_41c0 [128];
  undefined1 local_4140 [64];
  undefined1 local_4100 [64];
  undefined1 local_40c0 [64];
  undefined1 local_4080 [64];
  undefined1 local_4040 [64];
  undefined1 local_4000 [64];
  undefined1 local_3fc0 [64];
  undefined1 local_3f80 [64];
  undefined1 local_3f40 [64];
  undefined1 local_3f00 [64];
  undefined1 local_3ec0 [64];
  undefined1 local_3e80 [64];
  Matrix<double,_9,_9,_1,_9,_9> local_2f88;
  undefined1 local_2d00 [32];
  double local_2ce0;
  double local_2cb0;
  Matrix<double,_24,_24,_1,_24,_24> *local_2c80;
  double local_2c50;
  Matrix<double,_24,_24,_1,_24,_24> local_2c40;
  ulong local_1a40;
  Matrix<double,_24,_24,_1,_24,_24> *local_19c0;
  Matrix<double,_24,_24,_1,_24,_24> local_1980;
  ulong local_780;
  Matrix<double,_9,_24,_1,_9,_24> local_740;
  
  local_5390._8_8_ = local_5390._0_8_;
  local_5370._8_8_ = local_5370._0_8_;
  local_54d0._8_8_ = in_XMM1_Qb;
  local_54d0._0_8_ = y;
  local_54e0._8_8_ = local_54e0._0_8_;
  local_54e0._0_8_ = z;
  local_5300._8_8_ = in_XMM0_Qb;
  local_5300._0_8_ = x;
  local_5340._8_8_ = y;
  local_5340._0_8_ = y;
  auVar97 = vpermi2pd_avx512f(_DAT_009aae40,ZEXT864((ulong)(1.0 - y)),
                              ZEXT1664(CONCAT88(y + 1.0,y + 1.0)));
  dVar161 = x + 1.0;
  auVar87._8_8_ = dVar161;
  auVar87._0_8_ = dVar161;
  auVar87._16_8_ = dVar161;
  auVar87._24_8_ = dVar161;
  auVar89._8_8_ = 0x3fd0000000000000;
  auVar89._0_8_ = 0x3fd0000000000000;
  auVar89._16_8_ = 0x3fd0000000000000;
  auVar89._24_8_ = 0x3fd0000000000000;
  auVar88 = ZEXT1632(CONCAT88(z * this->m_element->m_thickness * 0.5 * 0.25,1.0 - x));
  auVar87 = vblendpd_avx(auVar88,auVar87,0xc);
  auVar88 = vpermpd_avx2(auVar88,0x60);
  auVar88 = vunpckhpd_avx(auVar89,auVar88);
  auVar149 = ZEXT3264(CONCAT824(auVar87._24_8_ * auVar88._24_8_,
                                CONCAT816(auVar87._16_8_ * auVar88._16_8_,
                                          CONCAT88(auVar87._8_8_ * auVar88._8_8_,
                                                   auVar87._0_8_ * auVar88._0_8_))));
  auVar149 = vshuff64x2_avx512f(auVar149,auVar149,0x14);
  local_5000 = vmulpd_avx512f(auVar149,auVar97);
  local_5358 = result;
  local_4c80 = local_5000;
  local_53c0 = ChElementShellANCF_3423::Calc_detJ0
                         (this->m_element,x,y,z,&local_5440,&local_5480,(ShapeVector *)&local_4cc0,
                          &local_4dc8,&local_4de0,&local_4df8);
  auVar70 = ZEXT816(0x3fe0000000000000);
  auVar170._8_8_ = 0;
  auVar170._0_8_ =
       local_4dc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       local_4de0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar155._8_8_ = 0;
  auVar155._0_8_ =
       local_4de0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar80 = vfmadd213sd_fma(ZEXT816(0xbfe0000000000000),local_5300._0_16_,auVar70);
  local_5040._0_8_ =
       local_4dc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  local_5080._0_8_ =
       local_4de0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  local_5280 = auVar80._0_8_;
  local_5370._0_8_ = local_5280;
  auVar80 = vunpcklpd_avx(local_5300._0_16_,local_5340._0_16_);
  auVar68._8_8_ = 0x3fe0000000000000;
  auVar68._0_8_ = 0x3fe0000000000000;
  local_5380 = vfmadd213pd_avx512vl(_DAT_009aa850,auVar80,auVar68);
  auVar80 = vfmadd213sd_fma(auVar70,local_54d0,auVar70);
  auVar75._8_8_ = 0;
  auVar75._0_8_ =
       local_4dc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  local_5268 = auVar80._0_8_;
  local_5390._0_8_ = local_5268;
  local_4f00[1] = 0.0;
  local_4f00[2] = 0.0;
  local_4f00[3] = 0.0;
  local_4f00[4] = 0.0;
  local_4f00[5] = 0.0;
  local_4f00[7] = 0.0;
  local_4f00[0x10] = 0.0;
  local_4f00[0x11] = 0.0;
  local_4f00[0x12] = 0.0;
  adStack_4e60[0] = 0.0;
  adStack_4e60[1] = 0.0;
  local_4f00[8] = 0.0;
  local_4f00[9] = 0.0;
  local_4f00[10] = 0.0;
  local_4f00[0xb] = 0.0;
  local_4f00[0xe] = 0.0;
  local_4f00[0xf] = 0.0;
  adStack_4e60[2] = 0.0;
  adStack_4e60[3] = 0.0;
  adStack_4e60[4] = 0.0;
  adStack_4e60[5] = 0.0;
  adStack_4e60[6] = 0.0;
  adStack_4e60[7] = 0.0;
  adStack_4e60[8] = 0.0;
  adStack_4e60[9] = 0.0;
  local_4f00[0] = local_5300._0_8_;
  local_4f00[6] = local_54d0._0_8_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       local_4de0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       local_4dc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  local_5300._0_8_ =
       local_4dc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  local_4f00[0x13] = (double)local_54e0._0_8_;
  local_5180._0_8_ =
       local_4de0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  local_53e0._0_8_ =
       local_4dc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar80._8_8_ = 0;
  auVar80._0_8_ =
       local_4de0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2] *
       local_4dc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  local_54b0 = vfmsub231sd_fma(auVar80,auVar75,auVar77);
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       local_4dc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1] *
       local_4dc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar80 = vfmadd231sd_fma(auVar78,auVar170,auVar170);
  auVar80 = vfmadd231sd_fma(auVar80,auVar75,auVar75);
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       local_4de0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0] *
       local_4dc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar68 = vfmsub231sd_fma(auVar70,auVar170,auVar155);
  auVar80 = vsqrtsd_avx(auVar80,auVar80);
  dVar130 = 1.0 / auVar80._0_8_;
  local_5230 = local_4dc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[1] * dVar130;
  local_5350 = local_4dc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[2] * dVar130;
  dVar161 = local_54b0._0_8_;
  auVar171._8_8_ = 0;
  auVar171._0_8_ =
       local_4de0.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1] *
       local_4dc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  local_54c0 = vfmsub231sd_fma(auVar171,auVar71,auVar69);
  uStack_5228 = 0;
  local_5200._8_8_ = 0;
  local_5200._0_8_ =
       local_4dc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0] * dVar130;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar161 * dVar161;
  auVar80 = vfmadd231sd_fma(auVar79,local_54c0,local_54c0);
  auVar80 = vfmadd231sd_fma(auVar80,auVar68,auVar68);
  auVar80 = vsqrtsd_avx(auVar80,auVar80);
  dVar131 = 1.0 / auVar80._0_8_;
  bVar55 = 2.2250738585072014e-308 <= auVar80._0_8_;
  local_51c0._0_8_ =
       (ulong)bVar55 * (long)(local_54c0._0_8_ * dVar131) + (ulong)!bVar55 * 0x3ff0000000000000;
  dVar161 = (double)((ulong)bVar55 * (long)(dVar161 * dVar131));
  local_5490._8_8_ = 0;
  local_5490._0_8_ = dVar161;
  dVar131 = (double)((ulong)bVar55 * (long)(auVar68._0_8_ * dVar131));
  local_53f0._8_8_ = 0;
  local_53f0._0_8_ = dVar131;
  local_51c0._8_8_ = 0;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = local_5230 * dVar131;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = local_5350;
  local_54a0 = vfmsub231sd_fma(auVar67,local_5490,auVar192);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = local_5350 * (double)local_51c0._0_8_;
  local_53d0 = vfmsub231sd_fma(auVar73,local_5200._0_16_,local_53f0);
  local_50c0._8_8_ = 0x8000000000000000;
  local_50c0._0_8_ = 0x8000000000000000;
  local_54d0._0_8_ =
       local_4dc8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0] * dVar130 * -dVar161;
  dVar161 = (this->m_element->m_layers).
            super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
            ._M_impl.super__Vector_impl_data._M_start[this->m_kl].m_theta;
  local_5340._0_8_ = dVar161;
  local_54e0 = auVar77;
  uStack_53b8 = extraout_XMM0_Qb;
  local_5278 = local_5380;
  local_4f00[0xc] = local_4f00[0];
  local_4f00[0xd] = local_4f00[6];
  local_5240 = cos(dVar161);
  uStack_5238 = extraout_XMM0_Qb_00;
  local_5250 = sin((double)local_5340._0_8_);
  uStack_5248 = extraout_XMM0_Qb_01;
  local_5100._0_8_ = sin((double)local_5340._0_8_);
  local_5100._8_8_ = extraout_XMM0_Qb_02;
  auVar97._0_8_ = cos((double)local_5340._0_8_);
  auVar97._8_56_ = extraout_var;
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       local_4df8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar151._8_8_ = 0;
  auVar151._0_8_ =
       local_4df8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar184._8_8_ = 0;
  auVar184._0_8_ = local_5180._0_8_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ =
       local_4df8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar189._8_8_ = 0;
  auVar189._0_8_ = local_5300._0_8_;
  auVar81._8_8_ = uStack_5248;
  auVar81._0_8_ = local_5250;
  auVar83._8_8_ = uStack_5238;
  auVar83._0_8_ = local_5240;
  auVar84._8_8_ = uStack_5228;
  auVar84._0_8_ = local_5230;
  lVar62 = 0;
  dVar161 = (double)((ulong)local_54e0._0_8_ ^ local_50c0._0_8_);
  auVar212._8_8_ = 0;
  auVar212._0_8_ = local_5350;
  auVar67 = vmulsd_avx512f(auVar212,local_5100._0_16_);
  pdVar63 = (double *)
            ((long)&(this->m_element->m_layers).
                    super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_kl].m_T0.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage + 0x28);
  local_2d00._16_8_ = &local_2ce0;
  auVar172._8_8_ = 0;
  auVar172._0_8_ =
       local_54e0._0_8_ *
       local_4df8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar80 = vfmsub231sd_fma(auVar172,auVar74,auVar184);
  auVar185._8_8_ = 0;
  auVar185._0_8_ = local_53e0._0_8_;
  auVar156._8_8_ = 0;
  auVar156._0_8_ =
       (double)local_5180._0_8_ *
       local_4df8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[1];
  auVar209._8_8_ = 0;
  auVar209._0_8_ = local_5080._0_8_;
  auVar68 = vfmsub231sd_avx512f(auVar156,auVar209,auVar72);
  auVar80 = vunpcklpd_avx(auVar68,auVar80);
  auVar68 = vmulsd_avx512f(auVar209,auVar74);
  auVar68 = vfmsub231sd_fma(auVar68,auVar151,local_54e0);
  auVar178._8_8_ = 0;
  auVar178._0_8_ =
       (double)local_53e0._0_8_ *
       local_4df8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  auVar70 = vfmsub231sd_fma(auVar178,auVar151,auVar189);
  auVar68 = vunpcklpd_avx(auVar68,auVar70);
  auVar179._8_8_ = 0;
  auVar179._0_8_ =
       (double)local_5300._0_8_ *
       local_4df8.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[0];
  auVar207._8_8_ = 0;
  auVar207._0_8_ = local_5040._0_8_;
  auVar69 = vfmsub231sd_avx512f(auVar179,auVar207,auVar72);
  auVar70 = vmulsd_avx512f(auVar207,auVar151);
  auVar70 = vfmsub231sd_fma(auVar70,auVar185,auVar74);
  auVar70 = vunpcklpd_avx(auVar69,auVar70);
  auVar69 = vunpcklpd_avx(local_54c0,local_54b0);
  auVar163._8_8_ = local_53c0;
  auVar163._0_8_ = local_53c0;
  auVar71 = vunpcklpd_avx512vl(auVar83,local_5100._0_16_);
  auVar72 = vmovddup_avx512vl(auVar84);
  auVar80 = vdivpd_avx(auVar80,auVar163);
  local_50c0 = ZEXT1664(auVar80);
  auVar73 = vdivpd_avx512vl(auVar69,auVar163);
  local_5100 = ZEXT1664(auVar73);
  auVar68 = vdivpd_avx(auVar68,auVar163);
  auVar70 = vdivpd_avx(auVar70,auVar163);
  local_5300._0_64_ = ZEXT1664(auVar70);
  auVar69 = vshufpd_avx(auVar80,auVar80,1);
  auVar78 = vshufpd_avx(auVar80,auVar70,1);
  auVar79 = vshufpd_avx(auVar68,auVar68,1);
  auVar74 = vshufpd_avx512vl(auVar73,auVar73,1);
  auVar75 = vmulsd_avx512f(local_5490,auVar69);
  auVar75 = vfmadd231sd_avx512f(auVar75,local_51c0._0_16_,auVar80);
  local_5180._0_16_ = auVar75;
  auVar75 = vunpcklpd_avx512vl(auVar81,auVar97._0_16_);
  auVar173._0_8_ = auVar75._0_8_ * (double)local_54a0._0_8_;
  auVar173._8_8_ = auVar75._8_8_ * (double)local_54a0._0_8_;
  auVar164._0_8_ = (double)local_53d0._0_8_ * auVar75._0_8_;
  auVar164._8_8_ = (double)local_53d0._0_8_ * auVar75._8_8_;
  auVar180._0_8_ = (double)local_5200._0_8_ * auVar71._0_8_;
  auVar180._8_8_ = (double)local_5200._0_8_ * auVar71._8_8_;
  auVar186._0_8_ = auVar72._0_8_ * auVar71._0_8_;
  auVar186._8_8_ = auVar72._8_8_ * auVar71._8_8_;
  auVar193._0_8_ = auVar186._0_8_ + auVar164._0_8_;
  auVar193._8_8_ = auVar186._8_8_ + auVar164._8_8_;
  auVar72 = vsubpd_avx(auVar164,auVar186);
  auVar190._0_8_ = auVar180._0_8_ + auVar173._0_8_;
  auVar190._8_8_ = auVar180._8_8_ + auVar173._8_8_;
  auVar75 = vsubpd_avx(auVar173,auVar180);
  auVar71 = vshufpd_avx(auVar72,auVar72,1);
  auVar76 = vmulsd_avx512f(auVar193,auVar70);
  auVar181._8_8_ = auVar75._8_8_;
  auVar181._0_8_ = auVar190._0_8_;
  auVar77 = vmulsd_avx512f(auVar71,auVar69);
  auVar69 = vshufpd_avx(auVar75,auVar75,1);
  auVar174._8_8_ = auVar68._8_8_;
  auVar174._0_8_ = auVar80._0_8_;
  auVar187._0_8_ = auVar193._0_8_ * auVar78._0_8_;
  auVar187._8_8_ = auVar72._8_8_ * auVar78._8_8_;
  auVar78 = vfmadd231sd_avx512f(auVar76,auVar190,auVar79);
  auVar72 = vfmadd231sd_avx512f(auVar77,auVar69,auVar80);
  auVar75 = vmulsd_avx512f(local_5490,auVar70);
  auVar80 = vfmadd213pd_fma(auVar174,auVar181,auVar187);
  auVar79 = vfmadd231sd_avx512f(auVar75,local_51c0._0_16_,auVar79);
  auVar201._8_8_ = 0;
  auVar201._0_8_ = auVar74._0_8_ * auVar71._0_8_;
  auVar69 = vfmadd231sd_avx512f(auVar201,auVar73,auVar69);
  local_5200._0_16_ = auVar80;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = auVar193._0_8_ * auVar74._0_8_;
  local_54e0 = vfmadd231sd_avx512f(auVar76,auVar73,auVar190);
  auVar80 = vmulsd_avx512f(auVar74,local_5490);
  local_5490 = vfmadd231sd_avx512f(auVar80,auVar73,local_51c0._0_16_);
  local_2c40.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.array
  [10] = pdVar63[-8];
  pmVar61 = (mul_assign_op<double,_double> *)local_2d00._16_8_;
  do {
    dVar131 = local_4f00[lVar62];
    dVar130 = local_4f00[lVar62 + 5];
    dVar167 = local_4f00[lVar62 + 10];
    dVar136 = local_4f00[lVar62 + 0xf];
    dVar137 = adStack_4e60[lVar62];
    dVar162 = adStack_4e60[lVar62 + 5];
    lVar66 = 0;
    pdVar64 = pdVar63;
    do {
      pdVar1 = pdVar64 + -4;
      pdVar2 = pdVar64 + -3;
      ppVar3 = (plain_array<double,_36,_1,_32> *)(pdVar64 + -5);
      dVar168 = *pdVar64;
      pdVar4 = pdVar64 + -1;
      pdVar5 = pdVar64 + -2;
      pdVar64 = pdVar64 + 6;
      *(double *)(pmVar61 + lVar66 * 8) =
           dVar131 * ppVar3->array[0] + dVar130 * *pdVar1 + dVar167 * *pdVar2 +
           dVar136 * *pdVar5 + dVar137 * *pdVar4 + dVar162 * dVar168;
      lVar66 = lVar66 + 1;
    } while (lVar66 != 6);
    lVar62 = lVar62 + 1;
    pmVar61 = pmVar61 + 0x30;
  } while (lVar62 != 5);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_54d0._0_8_;
  auVar80 = vfmadd213sd_avx512f(auVar84,local_51c0._0_16_,auVar10);
  auVar71 = vmulsd_avx512f(auVar212,auVar83);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = (double)local_53e0._0_8_ * dVar161;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = local_5040._0_8_;
  auVar210._8_8_ = 0;
  auVar210._0_8_ = local_5080._0_8_;
  auVar75 = vfmadd213sd_avx512f(auVar210,auVar208,auVar138);
  local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.array[0]
       = (double)&local_4730;
  local_41c0._8_8_ = local_2d00;
  local_41c0._0_8_ = &local_740;
  local_41c0._16_8_ = local_4c40;
  local_41c0._24_8_ =
       local_740.super_PlainObjectBase<Eigen::Matrix<double,_9,_24,_1,_9,_24>_>.m_storage.m_data.
       array[0];
  auVar81 = vmulsd_avx512f(auVar81,auVar80);
  auVar80 = vmulsd_avx512f(auVar97._0_16_,auVar80);
  dVar161 = auVar80._0_8_ - auVar67._0_8_;
  auVar80 = vpermilpd_avx(auVar70,1);
  auVar56._8_8_ = uStack_53b8;
  auVar56._0_8_ = local_53c0;
  local_5340._0_8_ = auVar68._0_8_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_5340._0_8_;
  local_51c0._8_8_ = 0;
  local_51c0._0_8_ = dVar161;
  local_54a0 = vfmadd231sd_avx512f(auVar72,local_51c0._0_16_,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_53f0._0_8_;
  local_54b0 = vfmadd231sd_fma(auVar79,auVar80,auVar12);
  local_54d0._8_8_ = 0;
  local_54d0._0_8_ = auVar71._0_8_ + auVar81._0_8_;
  local_53d0 = vfmadd231sd_avx512f(auVar78,local_54d0,auVar80);
  local_2c40.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.m_data.array
  [10] = local_2c40.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
         m_data.array[10] / local_53c0;
  local_54c0 = vdivsd_avx512f(auVar75,auVar56);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = dVar161;
  local_53e0 = vfmadd231sd_fma(auVar69,auVar157,local_54c0);
  local_4730.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array[0]
       = local_2c40.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
         m_data.array[10] * local_2ce0;
  local_4730.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array[1]
       = local_2c40.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
         m_data.array[10] * local_2cb0;
  local_4730.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array[2]
       = local_2c40.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
         m_data.array[10] * (double)local_2c80;
  local_4730.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data.array[3]
       = local_2c40.super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>.m_storage.
         m_data.array[10] * local_2c50;
  local_5340 = ZEXT1664(auVar68);
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_5,_1,_6,_5>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_5,_0,_6,_5>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_30>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_5,_1,_6,_5>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_5,_0,_6,_5>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_41c0);
  pCVar34 = this->m_element;
  sVar35 = this->m_kl;
  pMVar36 = (pCVar34->m_alphaEAS).
            super__Vector_base<Eigen::Matrix<double,_5,_1,_0,_5,_1>,_std::allocator<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  dVar131 = pMVar36[sVar35].super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.m_storage.
            m_data.array[0];
  dVar130 = *(double *)
             ((long)&pMVar36[sVar35].super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                     m_storage.m_data + 8);
  pdVar63 = (double *)
            ((long)&pMVar36[sVar35].super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                    m_storage.m_data + 0x10);
  dVar167 = *pdVar63;
  dVar136 = pdVar63[1];
  dVar161 = *(double *)
             ((long)&pMVar36[sVar35].super_PlainObjectBase<Eigen::Matrix<double,_5,_1,_0,_5,_1>_>.
                     m_storage.m_data + 0x20);
  pdVar63 = local_4730.super_PlainObjectBase<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>.m_storage.m_data
            .array + 4;
  lVar62 = 0;
  do {
    ppVar6 = (plain_array<double,_30,_1,_16> *)(pdVar63 + -4);
    pdVar1 = pdVar63 + -3;
    pdVar64 = pdVar63 + -2;
    pdVar2 = pdVar63 + -1;
    dVar137 = *pdVar63;
    pdVar63 = pdVar63 + 5;
    local_5130[lVar62] =
         dVar161 * dVar137 +
         dVar131 * ppVar6->array[0] + dVar167 * *pdVar64 + dVar130 * *pdVar1 + dVar136 * *pdVar2;
    lVar62 = lVar62 + 1;
  } while (lVar62 != 6);
  local_2d00._0_8_ = &local_5440;
  auVar68 = vunpcklpd_avx(local_54d0,local_51c0._0_16_);
  auVar80 = vmovlpd_avx(local_5300._0_16_,local_5340._0_8_);
  local_41c0._0_8_ = (DstEvaluatorType *)0x3ff0000000000000;
  auVar80 = vfmadd213pd_fma(auVar80,auVar68,local_5200._0_16_);
  local_5200 = ZEXT1664(auVar80);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_54c0._0_8_;
  local_54e0 = vfmadd231sd_fma(local_54e0,local_54d0,auVar13);
  local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4]
       = 0.0;
  local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5]
       = 0.0;
  local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6]
       = 0.0;
  local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7]
       = 0.0;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&pCVar34->m_ddT,(Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_2d00,
             &local_4d00,(Scalar *)local_41c0);
  local_2d00._0_8_ = &local_5480;
  local_41c0._0_8_ = (DstEvaluatorType *)0x3ff0000000000000;
  local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4]
       = 0.0;
  local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5]
       = 0.0;
  local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6]
       = 0.0;
  local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7]
       = 0.0;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&this->m_element->m_ddT,(Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_2d00,
             &local_4d40,(Scalar *)local_41c0);
  local_2d00._0_8_ = &local_5440;
  local_41c0._0_8_ = (DstEvaluatorType *)0x3ff0000000000000;
  local_54d0._0_8_ = this;
  local_4780.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_4780.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_4780.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_4780.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  local_4780.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4]
       = 0.0;
  local_4780.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5]
       = 0.0;
  local_4780.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6]
       = 0.0;
  local_4780.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7]
       = 0.0;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            (&this->m_element->m_d0d0T,
             (Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_2d00,&local_4780,
             (Scalar *)local_41c0);
  uVar57 = local_54d0._0_8_;
  local_41c0._0_8_ = 0x3ff0000000000000;
  local_2d00._0_8_ = &local_5480;
  local_47c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[0]
       = 0.0;
  local_47c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[1]
       = 0.0;
  local_47c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[2]
       = 0.0;
  local_47c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  local_47c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[4]
       = 0.0;
  local_47c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[5]
       = 0.0;
  local_47c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[6]
       = 0.0;
  local_47c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.array[7]
       = 0.0;
  Eigen::internal::gemv_dense_selector<2,1,true>::
  run<Eigen::Matrix<double,8,8,1,8,8>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,Eigen::Matrix<double,8,1,0,8,1>>
            ((Matrix<double,_8,_8,_1,_8,_8> *)(*(long *)(local_54d0._0_8_ + 8) + 0x2600),
             (Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_> *)local_2d00,&local_47c0,
             (Scalar *)local_41c0);
  auVar101._8_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar101._0_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar101._16_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar101._24_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar101._32_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar101._40_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar101._48_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar101._56_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  uVar37 = *(ulong *)(uVar57 + 8);
  auVar191._8_8_ = local_53f0._0_8_;
  auVar191._0_8_ = local_53f0._0_8_;
  lVar62 = 0;
  auVar98._8_8_ =
       local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[1];
  auVar98._0_8_ =
       local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[0];
  auVar98._16_8_ =
       local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[2];
  auVar98._24_8_ =
       local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[3];
  auVar98._32_8_ =
       local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[4];
  auVar98._40_8_ =
       local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[5];
  auVar98._48_8_ =
       local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[6];
  auVar98._56_8_ =
       local_4d00.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[7];
  auVar97 = vmulpd_avx512f(auVar101,auVar98);
  auVar100._8_8_ =
       local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[1];
  auVar100._0_8_ =
       local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[0];
  auVar100._16_8_ =
       local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[2];
  auVar100._24_8_ =
       local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[3];
  auVar100._32_8_ =
       local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[4];
  auVar100._40_8_ =
       local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[5];
  auVar100._48_8_ =
       local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[6];
  auVar100._56_8_ =
       local_4d40.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[7];
  auVar69 = vunpcklpd_avx512vl(local_54e0,local_54c0);
  auVar87 = vextractf64x4_avx512f(auVar97,1);
  auVar99._8_8_ =
       local_4780.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[1];
  auVar99._0_8_ =
       local_4780.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[0];
  auVar99._16_8_ =
       local_4780.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[2];
  auVar99._24_8_ =
       local_4780.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[3];
  auVar99._32_8_ =
       local_4780.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[4];
  auVar99._40_8_ =
       local_4780.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[5];
  auVar99._48_8_ =
       local_4780.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[6];
  auVar99._56_8_ =
       local_4780.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[7];
  auVar98 = vmulpd_avx512f(auVar101,auVar99);
  auVar88 = vextractf64x4_avx512f(auVar98,1);
  auVar149._8_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar149._0_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar149._16_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar149._24_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar149._32_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar149._40_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar149._48_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar149._56_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar102._8_8_ =
       local_47c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[1];
  auVar102._0_8_ =
       local_47c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[0];
  auVar102._16_8_ =
       local_47c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[2];
  auVar102._24_8_ =
       local_47c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[3];
  auVar102._32_8_ =
       local_47c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[4];
  auVar102._40_8_ =
       local_47c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[5];
  auVar102._48_8_ =
       local_47c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[6];
  auVar102._56_8_ =
       local_47c0.super_PlainObjectBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>.m_storage.m_data.
       array[7];
  auVar99 = vmulpd_avx512f(auVar149,auVar100);
  auVar100 = vmulpd_avx512f(auVar101,auVar100);
  auVar89 = vextractf64x4_avx512f(auVar99,1);
  auVar149 = vmulpd_avx512f(auVar149,auVar102);
  auVar101 = vmulpd_avx512f(auVar101,auVar102);
  auVar90 = vextractf64x4_avx512f(auVar149,1);
  auVar91 = vextractf64x4_avx512f(auVar101,1);
  auVar92 = vextractf64x4_avx512f(auVar100,1);
  dVar161 = auVar101._0_8_ + auVar91._0_8_ + auVar101._8_8_ + auVar91._8_8_;
  dVar131 = auVar101._16_8_ + auVar91._16_8_ + auVar101._24_8_ + auVar91._24_8_;
  auVar127._0_8_ = dVar161 + dVar131;
  auVar127._8_8_ = dVar161 + dVar131;
  dVar130 = auVar100._0_8_ + auVar92._0_8_ + auVar100._8_8_ + auVar92._8_8_;
  dVar167 = auVar100._16_8_ + auVar92._16_8_ + auVar100._24_8_ + auVar92._24_8_;
  dVar161 = ((auVar97._0_8_ + auVar87._0_8_ + auVar97._8_8_ + auVar87._8_8_ +
             auVar97._16_8_ + auVar87._16_8_ + auVar97._24_8_ + auVar87._24_8_) -
            (auVar98._0_8_ + auVar88._0_8_ + auVar98._8_8_ + auVar88._8_8_ +
            auVar98._16_8_ + auVar88._16_8_ + auVar98._24_8_ + auVar88._24_8_)) * 0.5;
  dVar131 = ((auVar99._0_8_ + auVar89._0_8_ + auVar99._8_8_ + auVar89._8_8_ +
             auVar99._16_8_ + auVar89._16_8_ + auVar99._24_8_ + auVar89._24_8_) -
            (auVar149._0_8_ + auVar90._0_8_ + auVar149._8_8_ + auVar90._8_8_ +
            auVar149._16_8_ + auVar90._16_8_ + auVar149._24_8_ + auVar90._24_8_)) * 0.5;
  auVar132._0_8_ = dVar130 + dVar167;
  auVar132._8_8_ = dVar130 + dVar167;
  auVar211._8_8_ = *(undefined8 *)(uVar37 + 0x2bb0);
  auVar211._0_8_ = *(undefined8 *)(uVar37 + 0x2bb0);
  auVar80 = vsubpd_avx(auVar132,auVar127);
  auVar70 = vextractf32x4_avx512f(local_5000,3);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(uVar37 + 0x2b80);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = local_5000._16_8_ * *(double *)(uVar37 + 0x2b88);
  auVar68 = vfmadd132sd_fma(local_5000._0_16_,auVar133,auVar14);
  auVar78 = vextractf32x4_avx512f(local_5000,2);
  dVar130 = (double)local_5380._0_8_ * *(double *)(uVar37 + 0x2ba8);
  auVar82._0_8_ = local_53d0._0_8_;
  auVar82._8_8_ = local_5200._8_8_;
  auVar74 = local_5200._0_16_;
  auVar79 = vshufpd_avx512vl(auVar74,auVar74,1);
  auVar71 = vmulsd_avx512f(local_53e0,auVar74);
  auVar79 = vmulsd_avx512f(auVar74,auVar79);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(uVar37 + 0x2b90);
  auVar68 = vfmadd132sd_fma(auVar78,auVar68,auVar15);
  auVar78 = vfmadd231sd_avx512f(auVar71,local_54a0,local_54e0);
  auVar79 = vfmadd231sd_avx512f(auVar79,local_54a0,local_53d0);
  auVar71 = vmulsd_avx512f(local_53e0,local_53d0);
  auVar71 = vunpcklpd_avx512vl(auVar71,local_5490);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(uVar37 + 0x2b98);
  auVar70 = vfmadd132sd_fma(auVar70,auVar68,auVar16);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = (double)local_5390._0_8_ * *(double *)(uVar37 + 0x2bb8);
  auVar68 = vunpcklpd_avx(local_5180._0_16_,auVar134);
  auVar139._8_8_ = local_5380._8_8_;
  auVar139._0_8_ = local_53f0._0_8_;
  auVar72 = vunpckhpd_avx512vl(auVar74,auVar191);
  dVar137 = auVar70._0_8_;
  local_5380 = vfmadd213pd_avx512vl(auVar211,auVar139,auVar68);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = local_5370._0_8_;
  auVar69 = vfmadd213pd_avx512vl(auVar69,auVar72,auVar71);
  local_5180 = ZEXT1664(auVar69);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(uVar37 + 0x2ba0);
  auVar194._8_8_ = 0;
  auVar194._0_8_ = dVar130;
  auVar70 = vfmadd231sd_fma(auVar194,auVar140,auVar17);
  auVar68 = vunpcklpd_avx512vl(auVar74,local_54a0);
  auVar165._8_8_ = dVar131;
  auVar165._0_8_ = dVar131;
  dVar167 = auVar68._0_8_;
  auVar144._0_8_ = dVar167 * dVar161;
  dVar136 = auVar68._8_8_;
  auVar144._8_8_ = dVar136 * dVar161;
  auVar71 = vmulpd_avx512vl(auVar82,auVar165);
  auVar72 = vshufpd_avx512vl(local_5380,local_5380,3);
  auVar75 = vshufpd_avx512vl(auVar69,auVar69,1);
  auVar81 = vshufpd_avx512vl(local_5380,local_5380,1);
  auVar83 = vmulpd_avx512vl(auVar68,auVar72);
  auVar81 = vmulpd_avx512vl(local_5380,auVar81);
  auVar71 = vmulpd_avx512vl(auVar82,auVar71);
  dVar130 = auVar80._0_8_;
  auVar166._8_8_ = dVar130;
  auVar166._0_8_ = dVar130;
  auVar182._0_8_ = dVar167 * dVar130;
  auVar182._8_8_ = dVar136 * dVar130;
  auVar68 = vfmadd231pd_fma(auVar71,auVar68,auVar144);
  auVar71 = vunpcklpd_avx512vl(local_54e0,local_53e0);
  auVar84 = vmulsd_avx512f(local_5380,auVar80);
  auVar202._0_8_ = (dVar137 + dVar137) * auVar71._0_8_;
  auVar202._8_8_ = (dVar137 + dVar137) * auVar71._8_8_;
  auVar67 = vmovddup_avx512vl(auVar70);
  auVar84 = vunpcklpd_avx512vl(auVar80,auVar84);
  auVar70 = vmulsd_avx512f(local_54b0,auVar70);
  auVar80 = vfmadd213pd_avx512vl(auVar182,auVar82,auVar68);
  auVar73 = vmovddup_avx512vl(local_54b0);
  auVar68 = vmulpd_avx512vl(auVar82,auVar67);
  auVar175._0_8_ = auVar71._0_8_ * dVar137;
  auVar175._8_8_ = auVar71._8_8_ * dVar137;
  auVar74 = vunpckhpd_avx512vl(auVar74,auVar73);
  auVar80 = vfmadd213pd_fma(auVar175,auVar71,auVar80);
  auVar80 = vfmadd213pd_fma(auVar83,auVar71,auVar80);
  local_53f0 = vfmadd213pd_fma(auVar68,auVar71,auVar80);
  auVar152._8_8_ = 0;
  auVar152._0_8_ = dVar161;
  auVar80 = vmulsd_avx512f(local_5380,auVar152);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = dVar131;
  auVar68 = vmulsd_avx512f(local_54b0,auVar158);
  auVar196._0_8_ = (dVar161 + dVar161) * dVar167;
  auVar196._8_8_ = (dVar161 + dVar161) * dVar136;
  auVar198._8_8_ = dVar131 + dVar131;
  auVar198._0_8_ = dVar131 + dVar131;
  auVar80 = vunpcklpd_avx(auVar196,auVar80);
  auVar83 = vmulpd_avx512vl(auVar82,auVar198);
  auVar68 = vunpcklpd_avx(auVar83,auVar68);
  auVar68 = vmulpd_avx512vl(auVar74,auVar68);
  auVar74 = vunpcklpd_avx512vl(local_54a0,local_5380);
  auVar80 = vfmadd213pd_avx512vl(auVar74,auVar80,auVar68);
  auVar68 = vunpcklpd_avx512vl(auVar79,auVar73);
  auVar85._0_8_ = local_53e0._0_8_;
  auVar85._8_8_ = auVar69._8_8_;
  auVar68 = vfmadd213pd_avx512vl(auVar68,auVar84,auVar80);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = auVar75._0_8_ * dVar137;
  auVar80 = vunpcklpd_avx(auVar202,auVar188);
  auVar80 = vfmadd213pd_fma(auVar85,auVar80,auVar68);
  auVar68 = vshufpd_avx512vl(local_5380,auVar81,1);
  auVar86._0_8_ = auVar78._0_8_;
  auVar86._8_8_ = auVar69._8_8_;
  auVar80 = vfmadd213pd_fma(auVar86,auVar68,auVar80);
  auVar68 = vunpcklpd_avx512vl(auVar67,auVar70);
  auVar159._0_8_ = auVar73._0_8_ * auVar83._0_8_;
  auVar159._8_8_ = auVar73._8_8_ * auVar83._8_8_;
  auVar80 = vfmadd213pd_avx512vl(auVar68,auVar69,auVar80);
  auVar153._0_8_ = auVar73._0_8_ * dVar167;
  auVar153._8_8_ = auVar73._8_8_ * dVar136;
  local_5000._0_16_ = auVar80;
  auVar68 = vmovddup_avx512vl(local_5380);
  auVar70 = vfmadd231pd_avx512vl(auVar153,auVar68,auVar82);
  local_51c0 = ZEXT1664(auVar70);
  auVar80 = vfmadd231pd_fma(auVar159,auVar68,auVar196);
  auVar80 = vfmadd231pd_fma(auVar80,auVar70,auVar166);
  auVar70 = vshufpd_avx512vl(auVar69,auVar69,3);
  auVar141._0_8_ = auVar70._0_8_ * dVar167;
  auVar141._8_8_ = auVar70._8_8_ * dVar136;
  auVar68 = vfmadd231pd_fma(auVar141,auVar71,auVar68);
  local_5040 = ZEXT1664(auVar68);
  auVar80 = vfmadd231pd_fma(auVar80,auVar70,auVar202);
  auVar70 = vmulpd_avx512vl(auVar70,auVar82);
  auVar70 = vfmadd231pd_fma(auVar70,auVar73,auVar71);
  local_5080 = ZEXT1664(auVar70);
  auVar80 = vfmadd231pd_avx512vl(auVar80,auVar68,auVar72);
  local_5370._0_16_ = vfmadd231pd_avx512vl(auVar80,auVar70,auVar67);
  local_5490 = auVar78;
  local_5390 = auVar79;
  memset(local_4ac0,0,0x300);
  dVar161 = *(double *)(uVar37 + 0x2810);
  dVar131 = *(double *)(uVar37 + 0x2828);
  auVar80 = *(undefined1 (*) [16])(uVar37 + 0x2800);
  auVar68 = *(undefined1 (*) [16])(uVar37 + 0x2818);
  auVar70 = *(undefined1 (*) [16])(uVar37 + 0x2830);
  auVar69 = *(undefined1 (*) [16])(uVar37 + 0x2848);
  auVar78 = *(undefined1 (*) [16])(uVar37 + 0x2860);
  auVar79 = *(undefined1 (*) [16])(uVar37 + 0x2878);
  auVar71 = *(undefined1 (*) [16])(uVar37 + 0x2890);
  auVar142._8_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar142._0_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar72 = *(undefined1 (*) [16])(uVar37 + 0x28a8);
  auVar38._8_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar38._0_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar75 = vmulpd_avx512vl(auVar80,auVar38);
  pauVar59 = (undefined1 (*) [32])local_4fc0;
  auVar39._8_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar39._0_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar75 = vfmadd231pd_avx512vl(auVar75,auVar68,auVar39);
  auVar40._8_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar40._0_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar75 = vfmadd231pd_avx512vl(auVar75,auVar70,auVar40);
  dVar130 = *(double *)(uVar37 + 0x2840);
  dVar167 = *(double *)(uVar37 + 0x2858);
  auVar197._8_8_ = 0;
  auVar197._0_8_ = dVar167;
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar81 = vmulsd_avx512f(auVar197,auVar18);
  auVar41._8_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar41._0_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar75 = vfmadd231pd_avx512vl(auVar75,auVar69,auVar41);
  auVar42._8_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar42._0_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar75 = vfmadd231pd_avx512vl(auVar75,auVar78,auVar42);
  auVar43._8_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar43._0_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar75 = vfmadd231pd_avx512vl(auVar75,auVar79,auVar43);
  auVar203._8_8_ = 0;
  auVar203._0_8_ =
       dVar130 * local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                 m_data.array[2];
  auVar81 = vaddsd_avx512f(auVar203,auVar81);
  auVar44._8_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar44._0_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar75 = vfmadd231pd_avx512vl(auVar75,auVar71,auVar44);
  auVar199._8_8_ = 0;
  auVar199._0_8_ =
       dVar161 * local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                 m_data.array[0] +
       dVar131 * local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
                 m_data.array[1];
  auVar81 = vaddsd_avx512f(auVar199,auVar81);
  dVar136 = *(double *)(uVar37 + 0x2870);
  auVar200._8_8_ = 0;
  auVar200._0_8_ = dVar136;
  dVar137 = *(double *)(uVar37 + 0x2888);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = dVar137;
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar83 = vmulsd_avx512f(auVar200,auVar19);
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar84 = vmulsd_avx512f(auVar204,auVar20);
  local_5220 = vfmadd231pd_fma(auVar75,auVar142,auVar72);
  auVar75 = vaddsd_avx512f(auVar83,auVar84);
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar205._8_8_ = 0;
  auVar205._0_8_ = *(ulong *)(uVar37 + 0x28a0);
  auVar83 = vmulsd_avx512f(auVar205,auVar21);
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(uVar37 + 0x28b8);
  auVar84 = vmulsd_avx512f(auVar142,auVar206);
  auVar83 = vaddsd_avx512f(auVar83,auVar84);
  auVar75 = vaddsd_avx512f(auVar75,auVar83);
  auVar75 = vaddsd_avx512f(auVar81,auVar75);
  uStack_5210 = auVar75._0_8_;
  auVar88._16_8_ = uStack_5210;
  auVar88._0_16_ = local_5220;
  auVar88._24_8_ = 0;
  do {
    dVar162 = local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
              m_data.array[lVar62];
    auVar90._8_8_ = dVar162;
    auVar90._0_8_ = dVar162;
    auVar90._16_8_ = dVar162;
    auVar90._24_8_ = dVar162;
    auVar87 = vmulpd_avx512vl(auVar88,auVar90);
    lVar62 = lVar62 + 1;
    auVar91._0_24_ = auVar87._0_24_;
    auVar91._24_8_ = *(undefined8 *)(*pauVar59 + 0x18);
    *pauVar59 = auVar91;
    pauVar59 = (undefined1 (*) [32])(*pauVar59 + 0x18);
  } while (lVar62 != 8);
  auVar45._8_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar45._0_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar80 = vmulpd_avx512vl(auVar80,auVar45);
  lVar62 = 0;
  pauVar59 = (undefined1 (*) [32])local_4fc0;
  auVar46._8_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar46._0_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar80 = vfmadd132pd_avx512vl(auVar68,auVar80,auVar46);
  auVar47._8_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar47._0_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar80 = vfmadd132pd_avx512vl(auVar70,auVar80,auVar47);
  auVar145._8_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar145._0_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar48._8_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar48._0_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar80 = vfmadd132pd_avx512vl(auVar69,auVar80,auVar48);
  auVar49._8_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar49._0_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar80 = vfmadd132pd_avx512vl(auVar78,auVar80,auVar49);
  auVar50._8_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar50._0_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar80 = vfmadd132pd_avx512vl(auVar79,auVar80,auVar50);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar68 = vmulsd_avx512f(auVar205,auVar22);
  auVar51._8_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar51._0_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar80 = vfmadd132pd_avx512vl(auVar71,auVar80,auVar51);
  local_53b0 = vfmadd213pd_fma(auVar72,auVar145,auVar80);
  auVar80 = vmulsd_avx512f(auVar206,auVar145);
  uVar8 = local_4fc0._40_8_;
  local_4c40[0] = local_4fc0._0_8_;
  local_4c40[1] = local_4fc0._8_8_;
  local_4c40[2] = local_4fc0._16_8_;
  local_4c40[3] = local_4fc0._24_8_;
  uStack_4c20 = local_4fc0._32_8_;
  dStack_4c18 = (double)local_4fc0._40_8_;
  uStack_4c10 = uStack_4f90;
  uStack_4c08 = uStack_4f88;
  dStack_53a0 = dVar161 * local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                          m_storage.m_data.array[0] +
                dVar131 * local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                          m_storage.m_data.array[1] +
                dVar130 * local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                          m_storage.m_data.array[2] +
                dVar167 * local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                          m_storage.m_data.array[3] +
                dVar136 * local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                          m_storage.m_data.array[4] +
                dVar137 * local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.
                          m_storage.m_data.array[5] + auVar68._0_8_ + auVar80._0_8_;
  local_4c00 = local_4f80._0_8_;
  uStack_4bf8 = local_4f80._8_8_;
  uStack_4bf0 = local_4f80._16_8_;
  uStack_4be8 = local_4f80._24_8_;
  uStack_4be0 = local_4f80._32_8_;
  uStack_4bd8 = local_4f80._40_8_;
  uStack_4bd0 = local_4f80._48_8_;
  uStack_4bc8 = local_4f80._56_8_;
  auVar92._16_8_ = dStack_53a0;
  auVar92._0_16_ = local_53b0;
  auVar92._24_8_ = 0;
  local_4bc0 = local_4f40;
  do {
    dVar161 = local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
              m_data.array[lVar62];
    auVar52._8_8_ = dVar161;
    auVar52._0_8_ = dVar161;
    auVar52._16_8_ = dVar161;
    auVar52._24_8_ = dVar161;
    auVar87 = vmulpd_avx512vl(auVar92,auVar52);
    lVar62 = lVar62 + 1;
    auVar93._0_24_ = auVar87._0_24_;
    auVar93._24_8_ = *(undefined8 *)(*pauVar59 + 0x18);
    *pauVar59 = auVar93;
    pauVar59 = (undefined1 (*) [32])(*pauVar59 + 0x18);
  } while (lVar62 != 8);
  lVar62 = 0;
  pauVar59 = (undefined1 (*) [32])local_4fc0;
  auVar94._16_8_ = dStack_53a0;
  auVar94._0_16_ = local_53b0;
  auVar94._24_8_ = 0;
  auVar95._16_8_ = uStack_5210;
  auVar95._0_16_ = local_5220;
  auVar95._24_8_ = 0;
  local_4b80._0_8_ = local_4fc0._0_8_;
  local_4b80._8_8_ = local_4fc0._8_8_;
  local_4b80._16_8_ = local_4fc0._16_8_;
  local_4b80._24_8_ = local_4fc0._24_8_;
  uStack_4b60 = local_4fc0._32_8_;
  uStack_4b58 = local_4fc0._40_8_;
  uStack_4b50 = uStack_4f90;
  uStack_4b48 = uStack_4f88;
  local_4b40 = local_4f80._0_8_;
  uStack_4b38 = local_4f80._8_8_;
  uStack_4b30 = local_4f80._16_8_;
  uStack_4b28 = local_4f80._24_8_;
  uStack_4b20 = local_4f80._32_8_;
  uStack_4b18 = local_4f80._40_8_;
  uStack_4b10 = local_4f80._48_8_;
  uStack_4b08 = local_4f80._56_8_;
  local_4b00 = local_4f40;
  do {
    dVar161 = local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
              m_data.array[lVar62];
    auVar53._8_8_ = dVar161;
    auVar53._0_8_ = dVar161;
    auVar53._16_8_ = dVar161;
    auVar53._24_8_ = dVar161;
    auVar87 = vmulpd_avx512vl(auVar95,auVar53);
    dVar161 = local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.
              m_data.array[lVar62];
    auVar54._8_8_ = dVar161;
    auVar54._0_8_ = dVar161;
    auVar54._16_8_ = dVar161;
    auVar54._24_8_ = dVar161;
    auVar87 = vfmadd231pd_avx512vl(auVar87,auVar94,auVar54);
    lVar62 = lVar62 + 1;
    auVar96._0_24_ = auVar87._0_24_;
    auVar96._24_8_ = *(undefined8 *)(*pauVar59 + 0x18);
    *pauVar59 = auVar96;
    pauVar59 = (undefined1 (*) [32])(*pauVar59 + 0x18);
  } while (lVar62 != 8);
  local_2d00._8_8_ = uVar37 + 0x2bc0;
  lVar62 = 0;
  local_4ac0[0] = local_4fc0._0_8_;
  local_4ac0[1] = local_4fc0._8_8_;
  local_4ac0[2] = local_4fc0._16_8_;
  local_4ac0[3] = local_4fc0._24_8_;
  uStack_4aa0 = local_4fc0._32_8_;
  uStack_4a98 = local_4fc0._40_8_;
  uStack_4a90 = uStack_4f90;
  uStack_4a88 = uStack_4f88;
  local_4a80 = local_4f80._0_8_;
  uStack_4a78 = local_4f80._8_8_;
  uStack_4a70 = local_4f80._16_8_;
  uStack_4a68 = local_4f80._24_8_;
  uStack_4a60 = local_4f80._32_8_;
  uStack_4a58 = local_4f80._40_8_;
  uStack_4a50 = local_4f80._48_8_;
  uStack_4a48 = local_4f80._56_8_;
  local_4a40 = local_4f40._0_8_;
  uStack_4a38 = local_4f40._8_8_;
  uStack_4a30 = local_4f40._16_8_;
  uStack_4a28 = local_4f40._24_8_;
  uStack_4a20 = local_4f40._32_8_;
  uStack_4a18 = local_4f40._40_8_;
  uStack_4a10 = local_4f40._48_8_;
  uStack_4a08 = local_4f40._56_8_;
  local_4a00 = ZEXT864(0) << 0x40;
  local_49c0 = ZEXT864(0) << 0x40;
  local_4980 = ZEXT864(0) << 0x40;
  do {
    local_2d00._0_8_ = *(undefined8 *)(local_4c80 + lVar62);
    if ((uVar37 & 0x3f) != 0) {
      __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                    "Eigen::internal::block_evaluator<Eigen::Matrix<double, 8, 24, 1>, 1, 24, true>::block_evaluator(const XprType &) [ArgType = Eigen::Matrix<double, 8, 24, 1>, BlockRows = 1, BlockCols = 24, InnerPanel = true, HasDirectAccess = true]"
                   );
    }
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_2d00._0_8_;
    auVar97 = vbroadcastsd_avx512f(auVar23);
    lVar62 = lVar62 + 0x10;
    auVar149 = vmulpd_avx512f(auVar97,*(undefined1 (*) [64])local_2d00._8_8_);
    auVar101 = vmulpd_avx512f(auVar97,*(undefined1 (*) [64])(local_2d00._8_8_ + 0x40));
    auVar97 = vmulpd_avx512f(auVar97,*(undefined1 (*) [64])(local_2d00._8_8_ + 0x80));
    local_2d00._8_8_ = local_2d00._8_8_ + 0xc0;
    local_4a00 = vaddpd_avx512f(local_4a00,auVar149);
    local_49c0 = vaddpd_avx512f(local_49c0,auVar101);
    local_4980 = vaddpd_avx512f(local_4980,auVar97);
  } while (lVar62 != 0x40);
  local_4f40 = ZEXT864(0) << 0x40;
  local_4900 = ZEXT864(0) << 0x40;
  local_48c0 = ZEXT864(0) << 0x40;
  lVar62 = 0;
  bVar55 = true;
  do {
    bVar60 = bVar55;
    pauVar7 = (undefined1 (*) [64])(uVar37 + 0x3040 + lVar62 * 0xc0);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)(local_5278 + lVar62 * 8 + 8);
    auVar97 = vbroadcastsd_avx512f(auVar24);
    auVar149 = vmulpd_avx512f(auVar97,*pauVar7);
    auVar101 = vmulpd_avx512f(auVar97,pauVar7[1]);
    auVar97 = vmulpd_avx512f(auVar97,pauVar7[2]);
    local_4f40 = vaddpd_avx512f(local_4f40,auVar149);
    local_4900 = vaddpd_avx512f(local_4900,auVar101);
    local_48c0 = vaddpd_avx512f(local_48c0,auVar97);
    lVar62 = 1;
    bVar55 = false;
  } while (bVar60);
  local_4940 = local_4f40;
  local_4f80 = local_4900;
  _local_4fc0 = ZEXT864(0) << 0x40;
  local_4f80 = ZEXT864(0) << 0x40;
  local_4f40 = ZEXT864(0) << 0x40;
  lVar62 = 0;
  puVar65 = &local_5280;
  bVar55 = true;
  do {
    bVar60 = bVar55;
    local_2d00._0_8_ = *puVar65;
    local_2d00._8_8_ = uVar37 + 0x2ec0 + lVar62;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = local_2d00._0_8_;
    auVar97 = vbroadcastsd_avx512f(auVar25);
    auVar149 = vmulpd_avx512f(auVar97,*(undefined1 (*) [64])local_2d00._8_8_);
    auVar101 = vmulpd_avx512f(auVar97,*(undefined1 (*) [64])(local_2d00._8_8_ + 0x40));
    auVar97 = vmulpd_avx512f(auVar97,*(undefined1 (*) [64])(local_2d00._8_8_ + 0x80));
    lVar62 = 0xc0;
    _local_4fc0 = vaddpd_avx512f(_local_4fc0,auVar149);
    local_4f80 = vaddpd_avx512f(local_4f80,auVar101);
    local_4f40 = vaddpd_avx512f(local_4f40,auVar97);
    puVar65 = (ulong *)local_5278;
    bVar55 = false;
  } while (bVar60);
  auVar97 = vbroadcastsd_avx512f(ZEXT816(1));
  local_4880 = _local_4fc0;
  local_4840 = local_4f80;
  auVar149 = vbroadcastsd_avx512f(local_53d0);
  local_4800 = local_4f40;
  auVar101 = vbroadcastsd_avx512f(local_54a0);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_54e0._0_8_;
  auVar100 = vbroadcastsd_avx512f(auVar26);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_5390._0_8_;
  auVar98 = vbroadcastsd_avx512f(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_5490._0_8_;
  auVar102 = vbroadcastsd_avx512f(auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_5380._0_8_;
  auVar99 = vbroadcastsd_avx512f(auVar29);
  auVar103 = vbroadcastsd_avx512f(local_53e0);
  auVar104 = vbroadcastsd_avx512f(local_54b0);
  lVar62 = 0;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = local_54b0._0_8_ * (double)uVar8;
  auVar105 = vbroadcastsd_avx512f(auVar195);
  auVar106 = vbroadcastsd_avx512f(local_5200._0_16_);
  auVar107 = vbroadcastsd_avx512f(local_5180._0_16_);
  auVar108 = vbroadcastsd_avx512f(local_51c0._0_16_);
  auVar109 = vbroadcastsd_avx512f(local_5040._0_16_);
  auVar110 = vbroadcastsd_avx512f(local_5080._0_16_);
  auVar111 = vpermpd_avx512f(auVar97,local_5200);
  auVar112 = vpermpd_avx512f(auVar97,local_5180);
  auVar113 = vpermpd_avx512f(auVar97,local_51c0);
  auVar114 = vpermpd_avx512f(auVar97,local_5040);
  auVar97 = vpermpd_avx512f(auVar97,local_5080);
  do {
    auVar122 = *(undefined1 (*) [64])(local_4b80 + lVar62 * 8);
    auVar125 = *(undefined1 (*) [64])(local_4c40 + lVar62);
    auVar9 = *(undefined1 (*) [64])(local_4ac0 + lVar62);
    auVar126 = *(undefined1 (*) [64])(local_4a00 + lVar62 * 8);
    auVar115 = vmulpd_avx512f(auVar149,auVar122);
    auVar116 = vmulpd_avx512f(auVar106,auVar125);
    auVar117 = vmulpd_avx512f(auVar111,auVar122);
    auVar118 = vaddpd_avx512f(auVar126,auVar126);
    auVar115 = vmulpd_avx512f(auVar149,auVar115);
    auVar119 = vmulpd_avx512f(auVar100,auVar118);
    auVar115 = vfmadd231pd_avx512f(auVar115,auVar106,auVar116);
    auVar116 = vmulpd_avx512f(auVar106,auVar9);
    auVar115 = vfmadd213pd_avx512f(auVar116,auVar149,auVar115);
    auVar116 = vmulpd_avx512f(auVar100,auVar126);
    auVar116 = vfmadd213pd_avx512f(auVar116,auVar100,auVar115);
    auVar115 = *(undefined1 (*) [64])(local_4940 + lVar62 * 8);
    auVar120 = vmulpd_avx512f(auVar106,auVar115);
    auVar120 = vfmadd213pd_avx512f(auVar120,auVar100,auVar116);
    auVar116 = *(undefined1 (*) [64])(local_4880 + lVar62 * 8);
    auVar121 = vmulpd_avx512f(auVar149,auVar116);
    auVar120 = vfmadd213pd_avx512f(auVar121,auVar100,auVar120);
    auVar121 = vmulpd_avx512f(auVar101,auVar125);
    *(undefined1 (*) [64])
     (local_4640.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
      array + lVar62) = auVar120;
    auVar117 = vmulpd_avx512f(auVar111,auVar117);
    auVar120 = vaddpd_avx512f(auVar122,auVar122);
    auVar122 = vmulpd_avx512f(auVar104,auVar122);
    auVar117 = vfmadd231pd_avx512f(auVar117,auVar101,auVar121);
    auVar121 = vmulpd_avx512f(auVar101,auVar9);
    auVar122 = vmulpd_avx512f(auVar104,auVar122);
    auVar123 = vmulpd_avx512f(auVar149,auVar120);
    auVar124 = vmulpd_avx512f(auVar111,auVar123);
    auVar117 = vfmadd213pd_avx512f(auVar121,auVar111,auVar117);
    auVar121 = vmulpd_avx512f(auVar103,auVar126);
    auVar117 = vfmadd213pd_avx512f(auVar121,auVar103,auVar117);
    auVar121 = vmulpd_avx512f(auVar101,auVar115);
    auVar117 = vfmadd213pd_avx512f(auVar121,auVar103,auVar117);
    auVar121 = vmulpd_avx512f(auVar111,auVar116);
    auVar117 = vfmadd213pd_avx512f(auVar121,auVar103,auVar117);
    auVar121 = vaddpd_avx512f(auVar125,auVar125);
    auVar125 = vmulpd_avx512f(auVar99,auVar125);
    auVar122 = vfmadd231pd_avx512f(auVar122,auVar99,auVar125);
    auVar125 = vmulpd_avx512f(auVar99,auVar9);
    *(undefined1 (*) [64])(local_41c0 + lVar62 * 8 + -0x3c0) = auVar117;
    auVar117 = vmulpd_avx512f(auVar106,auVar121);
    auVar122 = vfmadd213pd_avx512f(auVar125,auVar104,auVar122);
    auVar125 = vmulpd_avx512f(auVar112,auVar126);
    auVar126 = vfmadd231pd_avx512f(auVar124,auVar117,auVar101);
    auVar121 = vmulpd_avx512f(auVar101,auVar121);
    auVar122 = vfmadd213pd_avx512f(auVar125,auVar112,auVar122);
    auVar125 = vmulpd_avx512f(auVar99,auVar115);
    auVar126 = vfmadd231pd_avx512f(auVar126,auVar9,auVar98);
    auVar122 = vfmadd213pd_avx512f(auVar125,auVar112,auVar122);
    auVar125 = vmulpd_avx512f(auVar104,auVar123);
    auVar126 = vfmadd231pd_avx512f(auVar126,auVar119,auVar103);
    auVar125 = vfmadd231pd_avx512f(auVar125,auVar99,auVar117);
    auVar126 = vfmadd231pd_avx512f(auVar126,auVar115,auVar102);
    auVar122 = vfmadd231pd_avx512f(auVar122,auVar105,auVar112);
    auVar125 = vfmadd231pd_avx512f(auVar125,auVar9,auVar108);
    auVar126 = vfmadd231pd_avx512f(auVar126,auVar116,auVar107);
    auVar125 = vfmadd231pd_avx512f(auVar125,auVar112,auVar119);
    *(undefined1 (*) [64])(local_41c0 + lVar62 * 8 + -0x300) = auVar126;
    *(undefined1 (*) [64])(local_41c0 + lVar62 * 8 + -0x240) = auVar122;
    auVar122 = vfmadd231pd_avx512f(auVar125,auVar115,auVar109);
    auVar122 = vfmadd231pd_avx512f(auVar122,auVar116,auVar110);
    *(undefined1 (*) [64])(local_41c0 + lVar62 * 8 + -0x180) = auVar122;
    auVar122 = vmulpd_avx512f(auVar111,auVar120);
    auVar122 = vmulpd_avx512f(auVar104,auVar122);
    auVar122 = vfmadd231pd_avx512f(auVar122,auVar99,auVar121);
    auVar122 = vfmadd231pd_avx512f(auVar122,auVar113,auVar9);
    auVar125 = vmulpd_avx512f(auVar103,auVar118);
    auVar122 = vfmadd213pd_avx512f(auVar125,auVar112,auVar122);
    auVar122 = vfmadd231pd_avx512f(auVar122,auVar114,auVar115);
    auVar122 = vfmadd231pd_avx512f(auVar122,auVar97,auVar116);
    *(undefined1 (*) [64])(local_41c0 + lVar62 * 8 + -0xc0) = auVar122;
    lVar62 = lVar62 + 8;
  } while (lVar62 != 0x18);
  lVar62 = 0;
  memset(&local_740,0,0x6c0);
  auVar97 = vbroadcastsd_avx512f(ZEXT816(1));
  auVar103._8_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar103._0_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar103._16_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar103._24_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar103._32_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar103._40_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar103._48_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar103._56_8_ =
       local_5480.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar104._8_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[1];
  auVar104._0_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[0];
  auVar104._16_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[2];
  auVar104._24_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[3];
  auVar104._32_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[4];
  auVar104._40_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[5];
  auVar104._48_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[6];
  auVar104._56_8_ =
       local_5440.super_PlainObjectBase<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>.m_storage.m_data.
       array[7];
  auVar107 = ZEXT3264(_DAT_00998580);
  auVar108 = ZEXT3264(_DAT_009985a0);
  auVar149 = vpermpd_avx512f(auVar97,local_5340);
  auVar101 = vbroadcastsd_avx512f(local_50c0._0_16_);
  auVar100 = vbroadcastsd_avx512f(local_5100._0_16_);
  auVar98 = vbroadcastsd_avx512f(local_5300._0_16_);
  auVar102 = vpermpd_avx512f(auVar97,local_50c0);
  auVar99 = vpermpd_avx512f(auVar97,local_5100);
  auVar97 = vpermpd_avx512f(auVar97,local_5300._0_64_);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_54c0._0_8_;
  auVar105 = vbroadcastsd_avx512f(auVar30);
  auVar106 = vbroadcastsd_avx512f(local_5340._0_16_);
  auVar149 = vmulpd_avx512f(auVar149,auVar103);
  auVar149 = vfmadd231pd_avx512f(auVar149,auVar104,auVar101);
  auVar149 = vfmadd231pd_avx512f(auVar149,(undefined1  [64])local_4cc0.m_data.array,auVar100);
  auVar101 = ZEXT3264(_DAT_00998460);
  vscatterdpd_avx512f(ZEXT864(&local_740) + auVar101 * (undefined1  [64])0x8,0xffff,auVar149);
  vscatterdpd_avx512f(ZEXT864(&local_740) + ZEXT864(0xc0) + auVar107 * (undefined1  [64])0x8,0xffff,
                      auVar149);
  vscatterdpd_avx512f(ZEXT864(&local_740) + ZEXT864(0x180) + auVar108 * (undefined1  [64])0x8,0xffff
                      ,auVar149);
  auVar149 = vmulpd_avx512f(auVar98,auVar103);
  auVar149 = vfmadd231pd_avx512f(auVar149,auVar104,auVar102);
  auVar149 = vfmadd231pd_avx512f(auVar149,(undefined1  [64])local_4cc0.m_data.array,auVar99);
  vscatterdpd_avx512f(ZEXT864(&local_740) + ZEXT864(0x240) + auVar101 * (undefined1  [64])0x8,0xffff
                      ,auVar149);
  vscatterdpd_avx512f(ZEXT864(&local_740) + ZEXT864(0x300) + auVar107 * (undefined1  [64])0x8,0xffff
                      ,auVar149);
  vscatterdpd_avx512f(ZEXT864(&local_740) + ZEXT864(0x3c0) + auVar108 * (undefined1  [64])0x8,0xffff
                      ,auVar149);
  auVar97 = vmulpd_avx512f(auVar97,auVar103);
  auVar97 = vfmadd231pd_avx512f(auVar97,auVar104,auVar106);
  auVar97 = vfmadd231pd_avx512f(auVar97,(undefined1  [64])local_4cc0.m_data.array,auVar105);
  auVar68 = ZEXT816(0) << 0x40;
  vscatterdpd_avx512f(ZEXT864(&local_740) + ZEXT864(0x480) + auVar101 * (undefined1  [64])0x8,0xffff
                      ,auVar97);
  auVar70 = ZEXT816(0) << 0x40;
  vscatterdpd_avx512f(ZEXT864(&local_740) + ZEXT864(0x540) + auVar107 * (undefined1  [64])0x8,0xffff
                      ,auVar97);
  vscatterdpd_avx512f(ZEXT864(&local_740) + ZEXT864(0x600) + auVar108 * (undefined1  [64])0x8,0xffff
                      ,auVar97);
  auVar80 = ZEXT816(0) << 0x40;
  do {
    auVar146._8_8_ = 0;
    auVar146._0_8_ =
         local_4640.super_PlainObjectBase<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>.m_storage.m_data.
         array[lVar62];
    uVar8 = *(undefined8 *)(uVar37 + 0x2ac0 + lVar62 * 8);
    auVar160._8_8_ = uVar8;
    auVar160._0_8_ = uVar8;
    auVar154._8_8_ = 0;
    auVar154._0_8_ = *(ulong *)(local_41c0 + lVar62 * 8 + -0x300);
    auVar69 = vmovhpd_avx(auVar146,*(undefined8 *)(local_41c0 + lVar62 * 8 + -0x3c0));
    auVar80 = vfmadd231pd_fma(auVar80,auVar160,auVar69);
    auVar69 = vmovhpd_avx(auVar154,*(undefined8 *)(local_41c0 + lVar62 * 8 + -0x240));
    auVar68 = vfmadd231pd_fma(auVar68,auVar160,auVar69);
    auVar147._8_8_ = 0;
    auVar147._0_8_ = *(ulong *)(local_41c0 + lVar62 * 8 + -0x180);
    auVar69 = vmovhpd_avx(auVar147,*(undefined8 *)(local_41c0 + lVar62 * 8 + -0xc0));
    lVar62 = lVar62 + 1;
    auVar70 = vfmadd231pd_fma(auVar70,auVar160,auVar69);
  } while (lVar62 != 0x18);
  lVar66 = *(long *)(uVar57 + 0x20) * 0x160;
  dVar161 = *(double *)(uVar37 + 200);
  lVar62 = *(long *)(*(long *)(uVar37 + 0x70) + 8 + lVar66);
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             (*(long *)(uVar37 + 0x70) + 0x10 + lVar66);
  dVar131 = auVar80._0_8_ * dVar161;
  dVar130 = auVar80._8_8_ * dVar161;
  dVar167 = auVar68._0_8_ * dVar161;
  dVar136 = auVar68._8_8_ * dVar161;
  dVar137 = auVar70._0_8_ * dVar161;
  dVar161 = auVar70._8_8_ * dVar161;
  dVar162 = (double)local_53f0._0_8_ + local_5130[0];
  dVar168 = (double)local_53f0._8_8_ + local_5130[1];
  dVar169 = (double)local_5000._0_8_ + local_5130[2];
  dVar176 = (double)local_5000._8_8_ + local_5130[3];
  dVar177 = (double)local_5370._0_8_ + local_5130[4];
  dVar183 = (double)local_5370._8_8_ + local_5130[5];
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_5340._8_8_ = (double)local_53f0._8_8_ + local_5130[1];
    local_5340._0_8_ = (double)local_53f0._0_8_ + local_5130[0];
    local_54e0._8_8_ = (double)local_5000._8_8_ + local_5130[3];
    local_54e0._0_8_ = (double)local_5000._0_8_ + local_5130[2];
    local_5300._8_8_ = (double)local_5370._8_8_ + local_5130[5];
    local_5300._0_8_ = (double)local_5370._0_8_ + local_5130[4];
    local_54c0._8_8_ = dVar130;
    local_54c0._0_8_ = dVar131;
    local_54a0._8_8_ = dVar136;
    local_54a0._0_8_ = dVar167;
    local_54b0._8_8_ = dVar161;
    local_54b0._0_8_ = dVar137;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    dVar131 = (double)local_54c0._0_8_;
    dVar130 = (double)local_54c0._8_8_;
    dVar167 = (double)local_54a0._0_8_;
    dVar136 = (double)local_54a0._8_8_;
    dVar137 = (double)local_54b0._0_8_;
    dVar161 = (double)local_54b0._8_8_;
    dVar162 = (double)local_5340._0_8_;
    dVar168 = (double)local_5340._8_8_;
    dVar169 = (double)local_54e0._0_8_;
    dVar176 = (double)local_54e0._8_8_;
    dVar177 = (double)local_5300._0_8_;
    dVar183 = (double)local_5300._8_8_;
  }
  local_4db0._16_8_ = lVar62 + 0x20;
  pdVar63 = (double *)(lVar62 + 0x40);
  lVar62 = 0;
  do {
    pdVar64 = pdVar63 + -2;
    pdVar2 = pdVar63 + -1;
    dVar143 = *pdVar63;
    pdVar4 = pdVar63 + 1;
    pdVar1 = pdVar63 + -4;
    pdVar5 = pdVar63 + -3;
    pdVar63 = pdVar63 + 6;
    dVar143 = (dVar162 + dVar131) * *pdVar1 +
              (dVar169 + dVar167) * *pdVar64 + (dVar177 + dVar137) * dVar143;
    dVar150 = (dVar168 + dVar130) * *pdVar5 +
              (dVar176 + dVar136) * *pdVar2 + (dVar183 + dVar161) * *pdVar4;
    auVar148._0_8_ = dVar143 + dVar150;
    auVar148._8_8_ = dVar143 + dVar150;
    dVar143 = (double)vmovlpd_avx(auVar148);
    local_52b0[lVar62] = dVar143;
    lVar62 = lVar62 + 1;
  } while (lVar62 != 6);
  memset(local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.
         array + 1,0,0x278);
  local_5340._0_8_ = local_4db0._16_8_;
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array[0]
       = local_52b0[0];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array[10]
       = local_52b0[0];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x14] = local_52b0[0];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array[3]
       = local_52b0[2];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0xd] = local_52b0[2];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x17] = local_52b0[2];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array[6]
       = local_52b0[4];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x10] = local_52b0[4];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x1a] = local_52b0[4];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x1b] = local_52b0[2];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x25] = local_52b0[2];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x2f] = local_52b0[2];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x1e] = local_52b0[1];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x28] = local_52b0[1];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x32] = local_52b0[1];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x21] = local_52b0[5];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x2b] = local_52b0[5];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x35] = local_52b0[5];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x36] = local_52b0[4];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x40] = local_52b0[4];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x4a] = local_52b0[4];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x39] = local_52b0[5];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x43] = local_52b0[5];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x4d] = local_52b0[5];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x3c] = local_52b0[3];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x46] = local_52b0[3];
  local_2f88.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.m_data.array
  [0x50] = local_52b0[3];
  local_4d58 = *(ulong *)(uVar57 + 0x10);
  auVar128._8_8_ = 0;
  auVar128._0_8_ = local_4d58;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = *(ulong *)(uVar57 + 0x18);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(*(long *)(uVar57 + 8) + 200);
  auVar80 = vfmadd132sd_fma(auVar135,auVar128,auVar31);
  local_4d78.m_rhs = &local_2f88;
  local_4d88 = auVar80._0_8_;
  local_4db0._8_8_ = &local_4640;
  local_4db0._24_8_ = &local_4640;
  local_4d78.m_lhs.m_matrix = &local_740;
  local_4d68 = &local_740;
  local_2c80 = &local_2c40;
  memset(&local_2c40,0,0x1200);
  local_41c0._0_8_ = (DstEvaluatorType *)0x3ff0000000000000;
  Eigen::internal::
  generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,24,1,6,24>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,24,1,6,24>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,24,24,1,24,24>>
            (&local_2c40,
             (Product<Eigen::Transpose<Eigen::Matrix<double,_6,_24,_1,_6,_24>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>
              *)(local_4db0 + 8),&local_4640,(Scalar *)local_41c0);
  a_rhs = local_4d68;
  local_1a40 = local_4d88;
  local_19c0 = &local_1980;
  memset(&local_1980,0,0x1200);
  local_41c0._0_8_ = 0x3ff0000000000000;
  Eigen::internal::
  generic_product_impl<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,9,24,1,9,24>>,Eigen::Matrix<double,9,9,1,9,9>,0>,Eigen::Matrix<double,9,24,1,9,24>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,24,24,1,24,24>>
            (&local_1980,&local_4d78,a_rhs,(Scalar *)local_41c0);
  lVar62 = 0x80;
  local_780 = local_4d58;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_1a40;
  auVar97 = vbroadcastsd_avx512f(auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_4d58;
  auVar149 = vbroadcastsd_avx512f(auVar33);
  do {
    auVar101 = vmulpd_avx512f(auVar97,*(undefined1 (*) [64])
                                       ((long)(local_2c80->
                                              super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                              ).m_storage.m_data.array + lVar62 + -0x80));
    auVar100 = vmulpd_avx512f(auVar149,*(undefined1 (*) [64])
                                        ((long)(local_19c0->
                                               super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                               ).m_storage.m_data.array + lVar62 + -0x80));
    auVar101 = vaddpd_avx512f(auVar101,auVar100);
    *(undefined1 (*) [64])(local_41c0 + lVar62 + -0x80) = auVar101;
    auVar101 = vmulpd_avx512f(auVar97,*(undefined1 (*) [64])
                                       ((long)(local_2c80->
                                              super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                              ).m_storage.m_data.array + lVar62 + -0x40));
    auVar100 = vmulpd_avx512f(auVar149,*(undefined1 (*) [64])
                                        ((long)(local_19c0->
                                               super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                               ).m_storage.m_data.array + lVar62 + -0x40));
    auVar101 = vaddpd_avx512f(auVar101,auVar100);
    *(undefined1 (*) [64])(local_41c0 + lVar62 + -0x40) = auVar101;
    auVar101 = vmulpd_avx512f(auVar97,*(undefined1 (*) [64])
                                       ((long)(local_2c80->
                                              super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                              ).m_storage.m_data.array + lVar62));
    auVar100 = vmulpd_avx512f(auVar149,*(undefined1 (*) [64])
                                        ((long)(local_19c0->
                                               super_PlainObjectBase<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>
                                               ).m_storage.m_data.array + lVar62));
    auVar101 = vaddpd_avx512f(auVar101,auVar100);
    *(undefined1 (*) [64])(local_41c0 + lVar62) = auVar101;
    lVar62 = lVar62 + 0xc0;
  } while (lVar62 != 0x1280);
  uVar57 = local_54d0._0_8_;
  local_2d00._8_8_ = local_4db0;
  local_4db0._0_8_ = local_53c0 * *(double *)(*(long *)(local_54d0._0_8_ + 8) + 0xc0);
  local_2d00._0_8_ = local_5348;
  local_2d00._16_8_ = &local_54e1;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = local_4db0._0_8_;
  auVar97 = vbroadcastsd_avx512f(auVar129);
  local_41c0._0_64_ = vmulpd_avx512f(auVar97,local_41c0._0_64_);
  local_41c0._64_64_ = vmulpd_avx512f(auVar97,local_41c0._64_64_);
  local_4140 = vmulpd_avx512f(auVar97,local_4140);
  local_4100 = vmulpd_avx512f(auVar97,local_4100);
  local_40c0 = vmulpd_avx512f(auVar97,local_40c0);
  local_4080 = vmulpd_avx512f(auVar97,local_4080);
  local_4040 = vmulpd_avx512f(auVar97,local_4040);
  local_4000 = vmulpd_avx512f(auVar97,local_4000);
  local_3fc0 = vmulpd_avx512f(auVar97,local_3fc0);
  local_3f80 = vmulpd_avx512f(auVar97,local_3f80);
  local_3f40 = vmulpd_avx512f(auVar97,local_3f40);
  local_3f00 = vmulpd_avx512f(auVar97,local_3f00);
  local_3ec0 = vmulpd_avx512f(auVar97,local_3ec0);
  local_3e80 = vmulpd_avx512f(auVar97,local_3e80);
  local_5348 = (undefined1  [8])local_41c0;
  local_2d00._24_8_ = (DstXprType *)local_41c0;
  Eigen::internal::
  copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_112,_576>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_24,_24,_1,_24,_24>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_24,_24,_1,_24,_24>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
         *)local_2d00);
  local_4d90.m_other = local_53c0 * *(double *)(*(long *)(uVar57 + 8) + 0xc0);
  local_4db0._0_8_ = &local_4730;
  local_4db0._8_8_ = local_5340._0_8_;
  local_4db0._16_8_ = &local_4640;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,5,24,1,5,24>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,5,1,6,5>>,Eigen::Matrix<double,6,6,1,6,6>,0>,Eigen::Matrix<double,6,24,1,6,24>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,5,24,1,5,24>const>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,_5,_24,_1,_5,_24> *)local_2d00,
             (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_5,_1,_6,_5>_>,_Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0>,_Eigen::Matrix<double,_6,_24,_1,_6,_24>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_5,_24,_1,_5,_24>_>_>
              *)local_4db0,(assign_op<double,_double> *)local_5348);
  pCVar58 = local_5358;
  memcpy(local_5358,(DstXprType *)local_41c0,0x1200);
  memcpy((pCVar58->super_PlainObjectBase<Eigen::Matrix<double,_696,_1,_0,_696,_1>_>).m_storage.
         m_data.array + 0x240,(Matrix<double,_5,_24,_1,_5,_24> *)local_2d00,0x3c0);
  return;
}

Assistant:

void ShellANCF_Jacobian::Evaluate(ChVectorN<double, 696>& result, const double x, const double y, const double z) {
    // Element shape function
    ChElementShellANCF_3423::ShapeVector N;
    m_element->ShapeFunctions(N, x, y, z);

    // Determinant of position vector gradient matrix: Initial configuration
    ChElementShellANCF_3423::ShapeVector Nx;
    ChElementShellANCF_3423::ShapeVector Ny;
    ChElementShellANCF_3423::ShapeVector Nz;
    ChMatrixNM<double, 1, 3> Nx_d0;
    ChMatrixNM<double, 1, 3> Ny_d0;
    ChMatrixNM<double, 1, 3> Nz_d0;
    double detJ0 = m_element->Calc_detJ0(x, y, z, Nx, Ny, Nz, Nx_d0, Ny_d0, Nz_d0);

    // ANS shape function
    ChMatrixNM<double, 1, 4> S_ANS;  // Shape function vector for Assumed Natural Strain
    ChMatrixNM<double, 6, 5> M;      // Shape function vector for Enhanced Assumed Strain
    m_element->ShapeFunctionANSbilinearShell(S_ANS, x, y);
    m_element->Basis_M(M, x, y, z);

    // Transformation : Orthogonal transformation (A and J)
    ChVector<double> G1xG2;  // Cross product of first and second column of
    double G1dotG1;          // Dot product of first column of position vector gradient

    G1xG2.x() = Nx_d0(1) * Ny_d0(2) - Nx_d0(2) * Ny_d0(1);
    G1xG2.y() = Nx_d0(2) * Ny_d0(0) - Nx_d0(0) * Ny_d0(2);
    G1xG2.z() = Nx_d0(0) * Ny_d0(1) - Nx_d0(1) * Ny_d0(0);
    G1dotG1 = Nx_d0(0) * Nx_d0(0) + Nx_d0(1) * Nx_d0(1) + Nx_d0(2) * Nx_d0(2);

    // Tangent Frame
    ChVector<double> A1;
    ChVector<double> A2;
    ChVector<double> A3;
    A1.x() = Nx_d0(0);
    A1.y() = Nx_d0(1);
    A1.z() = Nx_d0(2);
    A1 = A1 / sqrt(G1dotG1);
    A3 = G1xG2.GetNormalized();
    A2.Cross(A3, A1);

    // Direction for orthotropic material
    double theta = m_element->GetLayer(m_kl).Get_theta();  // Fiber angle
    ChVector<double> AA1;
    ChVector<double> AA2;
    ChVector<double> AA3;
    AA1 = A1 * cos(theta) + A2 * sin(theta);
    AA2 = -A1 * sin(theta) + A2 * cos(theta);
    AA3 = A3;

    /// Beta
    ChMatrixNM<double, 3, 3> j0;
    ChVector<double> j01;
    ChVector<double> j02;
    ChVector<double> j03;
    // Calculates inverse of rd0 (j0) (position vector gradient: Initial Configuration)
    j0(0, 0) = Ny_d0(1) * Nz_d0(2) - Nz_d0(1) * Ny_d0(2);
    j0(0, 1) = Ny_d0(2) * Nz_d0(0) - Ny_d0(0) * Nz_d0(2);
    j0(0, 2) = Ny_d0(0) * Nz_d0(1) - Nz_d0(0) * Ny_d0(1);
    j0(1, 0) = Nz_d0(1) * Nx_d0(2) - Nx_d0(1) * Nz_d0(2);
    j0(1, 1) = Nz_d0(2) * Nx_d0(0) - Nx_d0(2) * Nz_d0(0);
    j0(1, 2) = Nz_d0(0) * Nx_d0(1) - Nz_d0(1) * Nx_d0(0);
    j0(2, 0) = Nx_d0(1) * Ny_d0(2) - Ny_d0(1) * Nx_d0(2);
    j0(2, 1) = Ny_d0(0) * Nx_d0(2) - Nx_d0(0) * Ny_d0(2);
    j0(2, 2) = Nx_d0(0) * Ny_d0(1) - Ny_d0(0) * Nx_d0(1);
    j0 /= detJ0;

    j01[0] = j0(0, 0);
    j02[0] = j0(1, 0);
    j03[0] = j0(2, 0);
    j01[1] = j0(0, 1);
    j02[1] = j0(1, 1);
    j03[1] = j0(2, 1);
    j01[2] = j0(0, 2);
    j02[2] = j0(1, 2);
    j03[2] = j0(2, 2);

    // Coefficients of contravariant transformation
    ChVectorN<double, 9> beta;
    beta(0) = Vdot(AA1, j01);
    beta(1) = Vdot(AA2, j01);
    beta(2) = Vdot(AA3, j01);
    beta(3) = Vdot(AA1, j02);
    beta(4) = Vdot(AA2, j02);
    beta(5) = Vdot(AA3, j02);
    beta(6) = Vdot(AA1, j03);
    beta(7) = Vdot(AA2, j03);
    beta(8) = Vdot(AA3, j03);

    // Transformation matrix, function of fiber angle
    const ChMatrixNM<double, 6, 6>& T0 = m_element->GetLayer(m_kl).Get_T0();
    // Determinant of the initial position vector gradient at the element center
    double detJ0C = m_element->GetLayer(m_kl).Get_detJ0C();

    // Enhanced Assumed Strain
    ChMatrixNM<double, 6, 5> G = T0 * M * (detJ0C / detJ0);
    ChVectorN<double, 6> strain_EAS = G * m_element->m_alphaEAS[m_kl];

    ChVectorN<double, 8> ddNx = m_element->m_ddT * Nx.transpose();
    ChVectorN<double, 8> ddNy = m_element->m_ddT * Ny.transpose();

    ChVectorN<double, 8> d0d0Nx = m_element->m_d0d0T * Nx.transpose();
    ChVectorN<double, 8> d0d0Ny = m_element->m_d0d0T * Ny.transpose();

    // Strain component
    ChVectorN<double, 6> strain_til;
    strain_til(0) = 0.5 * ((Nx * ddNx)(0, 0) - (Nx * d0d0Nx)(0, 0));
    strain_til(1) = 0.5 * ((Ny * ddNy)(0, 0) - (Ny * d0d0Ny)(0, 0));
    strain_til(2) = (Nx * ddNy)(0, 0) - (Nx * d0d0Ny)(0, 0);
    strain_til(3) = N(0) * m_element->m_strainANS(0) + N(2) * m_element->m_strainANS(1) +
                    N(4) * m_element->m_strainANS(2) + N(6) * m_element->m_strainANS(3);
    strain_til(4) = S_ANS(0, 2) * m_element->m_strainANS(6) + S_ANS(0, 3) * m_element->m_strainANS(7);
    strain_til(5) = S_ANS(0, 0) * m_element->m_strainANS(4) + S_ANS(0, 1) * m_element->m_strainANS(5);

    // For orthotropic material
    ChVectorN<double, 6> strain;

    strain(0) = strain_til(0) * beta(0) * beta(0) + strain_til(1) * beta(3) * beta(3) +
                strain_til(2) * beta(0) * beta(3) + strain_til(3) * beta(6) * beta(6) +
                strain_til(4) * beta(0) * beta(6) + strain_til(5) * beta(3) * beta(6);
    strain(1) = strain_til(0) * beta(1) * beta(1) + strain_til(1) * beta(4) * beta(4) +
                strain_til(2) * beta(1) * beta(4) + strain_til(3) * beta(7) * beta(7) +
                strain_til(4) * beta(1) * beta(7) + strain_til(5) * beta(4) * beta(7);
    strain(2) = strain_til(0) * 2.0 * beta(0) * beta(1) + strain_til(1) * 2.0 * beta(3) * beta(4) +
                strain_til(2) * (beta(1) * beta(3) + beta(0) * beta(4)) + strain_til(3) * 2.0 * beta(6) * beta(7) +
                strain_til(4) * (beta(1) * beta(6) + beta(0) * beta(7)) +
                strain_til(5) * (beta(4) * beta(6) + beta(3) * beta(7));
    strain(3) = strain_til(0) * beta(2) * beta(2) + strain_til(1) * beta(5) * beta(5) +
                strain_til(2) * beta(2) * beta(5) + strain_til(3) * beta(8) * beta(8) +
                strain_til(4) * beta(2) * beta(8) + strain_til(5) * beta(5) * beta(8);
    strain(4) = strain_til(0) * 2.0 * beta(0) * beta(2) + strain_til(1) * 2.0 * beta(3) * beta(5) +
                strain_til(2) * (beta(2) * beta(3) + beta(0) * beta(5)) + strain_til(3) * 2.0 * beta(6) * beta(8) +
                strain_til(4) * (beta(2) * beta(6) + beta(0) * beta(8)) +
                strain_til(5) * (beta(5) * beta(6) + beta(3) * beta(8));
    strain(5) = strain_til(0) * 2.0 * beta(1) * beta(2) + strain_til(1) * 2.0 * beta(4) * beta(5) +
                strain_til(2) * (beta(2) * beta(4) + beta(1) * beta(5)) + strain_til(3) * 2.0 * beta(7) * beta(8) +
                strain_til(4) * (beta(2) * beta(7) + beta(1) * beta(8)) +
                strain_til(5) * (beta(5) * beta(7) + beta(4) * beta(8));

    // Strain derivative component

    ChMatrixNM<double, 6, 24> strainD_til;
    strainD_til.setZero();

    ChMatrixNM<double, 1, 24> tempB;
    ChMatrixNM<double, 1, 3> tempB3;
    ChMatrixNM<double, 1, 3> tempB31;

    tempB3 = Nx * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Nx(0, i);
        }
    }
    strainD_til.row(0) = tempB;

    tempB3 = Ny * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Ny(0, i);
        }
    }
    strainD_til.row(1) = tempB;

    tempB31 = Nx * m_element->m_d;
    for (int i = 0; i < 8; i++) {
        for (int j = 0; j < 3; j++) {
            tempB(0, i * 3 + j) = tempB3(0, j) * Nx(0, i) + tempB31(0, j) * Ny(0, i);
        }
    }
    strainD_til.row(2) = tempB;

    tempB.setZero();
    for (int i = 0; i < 4; i++) {
        tempB += N(i * 2) * m_element->m_strainANS_D.row(i);
    }
    strainD_til.row(3) = tempB;  // strainD for zz

    tempB.setZero();
    for (int i = 0; i < 2; i++) {
        tempB += S_ANS(0, i + 2) * m_element->m_strainANS_D.row(i + 6);
    }
    strainD_til.row(4) = tempB;  // strainD for xz

    tempB.setZero();
    for (int i = 0; i < 2; i++) {
        tempB += S_ANS(0, i) * m_element->m_strainANS_D.row(i + 4);
    }
    strainD_til.row(5) = tempB;  // strainD for yz

    //// For orthotropic material
    ChMatrixNM<double, 6, 24> strainD;  // Derivative of the strains w.r.t. the coordinates. Includes orthotropy
    for (int ii = 0; ii < 24; ii++) {
        strainD(0, ii) = strainD_til(0, ii) * beta(0) * beta(0) + strainD_til(1, ii) * beta(3) * beta(3) +
                         strainD_til(2, ii) * beta(0) * beta(3) + strainD_til(3, ii) * beta(6) * beta(6) +
                         strainD_til(4, ii) * beta(0) * beta(6) + strainD_til(5, ii) * beta(3) * beta(6);
        strainD(1, ii) = strainD_til(0, ii) * beta(1) * beta(1) + strainD_til(1, ii) * beta(4) * beta(4) +
                         strainD_til(2, ii) * beta(1) * beta(4) + strainD_til(3, ii) * beta(7) * beta(7) +
                         strainD_til(4, ii) * beta(1) * beta(7) + strainD_til(5, ii) * beta(4) * beta(7);
        strainD(2, ii) = strainD_til(0, ii) * 2.0 * beta(0) * beta(1) + strainD_til(1, ii) * 2.0 * beta(3) * beta(4) +
                         strainD_til(2, ii) * (beta(1) * beta(3) + beta(0) * beta(4)) +
                         strainD_til(3, ii) * 2.0 * beta(6) * beta(7) +
                         strainD_til(4, ii) * (beta(1) * beta(6) + beta(0) * beta(7)) +
                         strainD_til(5, ii) * (beta(4) * beta(6) + beta(3) * beta(7));
        strainD(3, ii) = strainD_til(0, ii) * beta(2) * beta(2) + strainD_til(1, ii) * beta(5) * beta(5) +
                         strainD_til(2, ii) * beta(2) * beta(5) + strainD_til(3, ii) * beta(8) * beta(8) +
                         strainD_til(4, ii) * beta(2) * beta(8) + strainD_til(5) * beta(5) * beta(8);
        strainD(4, ii) = strainD_til(0, ii) * 2.0 * beta(0) * beta(2) + strainD_til(1, ii) * 2.0 * beta(3) * beta(5) +
                         strainD_til(2, ii) * (beta(2) * beta(3) + beta(0) * beta(5)) +
                         strainD_til(3, ii) * 2.0 * beta(6) * beta(8) +
                         strainD_til(4, ii) * (beta(2) * beta(6) + beta(0) * beta(8)) +
                         strainD_til(5, ii) * (beta(5) * beta(6) + beta(3) * beta(8));
        strainD(5, ii) = strainD_til(0, ii) * 2.0 * beta(1) * beta(2) + strainD_til(1, ii) * 2.0 * beta(4) * beta(5) +
                         strainD_til(2, ii) * (beta(2) * beta(4) + beta(1) * beta(5)) +
                         strainD_til(3, ii) * 2.0 * beta(7) * beta(8) +
                         strainD_til(4, ii) * (beta(2) * beta(7) + beta(1) * beta(8)) +
                         strainD_til(5, ii) * (beta(5) * beta(7) + beta(4) * beta(8));
    }

    /// Gd : Jacobian (w.r.t. coordinates) of the initial position vector gradient matrix
    ChMatrixNM<double, 9, 24> Gd;
    Gd.setZero();

    for (int ii = 0; ii < 8; ii++) {
        Gd(0, 3 * ii) = j0(0, 0) * Nx(0, ii) + j0(1, 0) * Ny(0, ii) + j0(2, 0) * Nz(0, ii);
        Gd(1, 3 * ii + 1) = j0(0, 0) * Nx(0, ii) + j0(1, 0) * Ny(0, ii) + j0(2, 0) * Nz(0, ii);
        Gd(2, 3 * ii + 2) = j0(0, 0) * Nx(0, ii) + j0(1, 0) * Ny(0, ii) + j0(2, 0) * Nz(0, ii);

        Gd(3, 3 * ii) = j0(0, 1) * Nx(0, ii) + j0(1, 1) * Ny(0, ii) + j0(2, 1) * Nz(0, ii);
        Gd(4, 3 * ii + 1) = j0(0, 1) * Nx(0, ii) + j0(1, 1) * Ny(0, ii) + j0(2, 1) * Nz(0, ii);
        Gd(5, 3 * ii + 2) = j0(0, 1) * Nx(0, ii) + j0(1, 1) * Ny(0, ii) + j0(2, 1) * Nz(0, ii);

        Gd(6, 3 * ii) = j0(0, 2) * Nx(0, ii) + j0(1, 2) * Ny(0, ii) + j0(2, 2) * Nz(0, ii);
        Gd(7, 3 * ii + 1) = j0(0, 2) * Nx(0, ii) + j0(1, 2) * Ny(0, ii) + j0(2, 2) * Nz(0, ii);
        Gd(8, 3 * ii + 2) = j0(0, 2) * Nx(0, ii) + j0(1, 2) * Ny(0, ii) + j0(2, 2) * Nz(0, ii);
    }

    // Enhanced Assumed Strain 2nd
    strain += strain_EAS;

    // Structural damping
    // Strain time derivative for structural damping
    ChVectorN<double, 6> DEPS;
    DEPS.setZero();
    for (int ii = 0; ii < 24; ii++) {
        DEPS(0) += strainD(0, ii) * m_element->m_d_dt(ii);
        DEPS(1) += strainD(1, ii) * m_element->m_d_dt(ii);
        DEPS(2) += strainD(2, ii) * m_element->m_d_dt(ii);
        DEPS(3) += strainD(3, ii) * m_element->m_d_dt(ii);
        DEPS(4) += strainD(4, ii) * m_element->m_d_dt(ii);
        DEPS(5) += strainD(5, ii) * m_element->m_d_dt(ii);
    }

    // Add structural damping
    strain += DEPS * m_element->m_Alpha;

    // Matrix of elastic coefficients: The input assumes the material *could* be orthotropic
    const ChMatrixNM<double, 6, 6>& E_eps = m_element->GetLayer(m_kl).GetMaterial()->Get_E_eps();

    // Stress tensor calculation
    ChVectorN<double, 6> stress = E_eps * strain;

    // Declaration and computation of Sigm, to be removed
    ChMatrixNM<double, 9, 9> Sigm;  ///< Rearrangement of stress vector (not always needed)
    Sigm.setZero();

    Sigm(0, 0) = stress(0);  // XX
    Sigm(1, 1) = stress(0);
    Sigm(2, 2) = stress(0);

    Sigm(0, 3) = stress(2);  // XY
    Sigm(1, 4) = stress(2);
    Sigm(2, 5) = stress(2);

    Sigm(0, 6) = stress(4);  // XZ
    Sigm(1, 7) = stress(4);
    Sigm(2, 8) = stress(4);

    Sigm(3, 0) = stress(2);  // XY
    Sigm(4, 1) = stress(2);
    Sigm(5, 2) = stress(2);

    Sigm(3, 3) = stress(1);  // YY
    Sigm(4, 4) = stress(1);
    Sigm(5, 5) = stress(1);

    Sigm(3, 6) = stress(5);  // YZ
    Sigm(4, 7) = stress(5);
    Sigm(5, 8) = stress(5);

    Sigm(6, 0) = stress(4);  // XZ
    Sigm(7, 1) = stress(4);
    Sigm(8, 2) = stress(4);

    Sigm(6, 3) = stress(5);  // YZ
    Sigm(7, 4) = stress(5);
    Sigm(8, 5) = stress(5);

    Sigm(6, 6) = stress(3);  // ZZ
    Sigm(7, 7) = stress(3);
    Sigm(8, 8) = stress(3);

    // Jacobian of internal forces (excluding the EAS contribution).
    ChMatrixNM<double, 24, 24> KTE;
    KTE = (strainD.transpose() * E_eps * strainD) * (m_Kfactor + m_Rfactor * m_element->m_Alpha) +
          (Gd.transpose() * Sigm * Gd) * m_Kfactor;
    KTE *= detJ0 * m_element->m_GaussScaling;

    // EAS cross-dependency matrix.
    ChMatrixNM<double, 5, 24> GDEPSP = (G.transpose() * E_eps * strainD) * (detJ0 * m_element->m_GaussScaling);

    // Load result vector (integrand)
    result.segment(0, 24 * 24) = Eigen::Map<ChVectorN<double, 24 * 24>>(KTE.data(), 24 * 24);
    result.segment(576, 5 * 24) = Eigen::Map<ChVectorN<double, 5 * 24>>(GDEPSP.data(), 5 * 24);
}